

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersector1<4>::
     intersect_h<embree::avx::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  uint uVar60;
  uint uVar61;
  ulong uVar62;
  undefined1 (*pauVar63) [32];
  uint uVar64;
  uint uVar65;
  uint uVar66;
  long lVar67;
  int iVar68;
  ulong uVar69;
  float fVar70;
  float fVar97;
  float fVar101;
  vint4 bi_2;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar71;
  float fVar72;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  float fVar108;
  float fVar111;
  float fVar114;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar98;
  float fVar102;
  float fVar104;
  float fVar105;
  float fVar117;
  undefined1 auVar89 [32];
  float fVar99;
  float fVar100;
  float fVar103;
  float fVar106;
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar115;
  float fVar116;
  undefined1 auVar90 [32];
  undefined1 auVar77 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar85 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar118;
  float fVar119;
  float fVar140;
  float fVar142;
  vint4 bi_1;
  undefined1 auVar120 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar144;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar132 [32];
  float fVar141;
  float fVar143;
  float fVar146;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  vint4 ai;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar155 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar189;
  float fVar190;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar184 [32];
  float fVar195;
  float fVar196;
  undefined1 auVar185 [32];
  float fVar197;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar198;
  float fVar216;
  float fVar217;
  vint4 bi;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar242;
  float fVar245;
  vint4 ai_2;
  undefined1 auVar225 [16];
  float fVar248;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar243;
  float fVar246;
  float fVar249;
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar231 [32];
  float fVar257;
  undefined1 auVar232 [32];
  float fVar244;
  float fVar247;
  float fVar250;
  float fVar252;
  float fVar254;
  float fVar256;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar258;
  float fVar259;
  float fVar269;
  float fVar271;
  undefined1 auVar260 [16];
  float fVar274;
  undefined1 auVar261 [16];
  undefined1 auVar263 [28];
  undefined1 auVar262 [16];
  float fVar270;
  float fVar272;
  float fVar275;
  float fVar281;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar273;
  float fVar276;
  float fVar278;
  float fVar280;
  float fVar282;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar277;
  float fVar279;
  undefined1 auVar268 [64];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar285 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [64];
  vint4 ai_1;
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar308;
  float fVar309;
  undefined1 auVar307 [64];
  undefined1 auVar310 [28];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [64];
  float fVar315;
  float fVar325;
  undefined1 auVar316 [32];
  float fVar326;
  undefined1 auVar317 [32];
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar318 [64];
  float fVar327;
  float fVar333;
  float fVar334;
  undefined1 auVar328 [16];
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar329 [32];
  float fVar335;
  float fVar339;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  float fVar340;
  float fVar346;
  float fVar348;
  undefined1 auVar342 [16];
  float fVar341;
  float fVar347;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar353;
  float fVar356;
  float fVar359;
  float fVar361;
  undefined1 auVar343 [32];
  float fVar354;
  float fVar357;
  float fVar360;
  undefined1 auVar344 [32];
  float fVar352;
  float fVar355;
  float fVar358;
  undefined1 auVar345 [64];
  undefined1 auVar362 [28];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [64];
  undefined1 auVar366 [32];
  undefined1 auVar367 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b0c;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_ab4;
  RTCFilterFunctionNArguments local_a98;
  int local_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined8 local_8d0;
  float local_8c8;
  float local_8c4;
  undefined4 local_8c0;
  uint local_8bc;
  uint local_8b8;
  uint local_8b4;
  uint local_8b0;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar7 = prim[1];
  uVar69 = (ulong)(byte)PVar7;
  fVar222 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar86 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  auVar283._0_4_ = fVar222 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar283._4_4_ = fVar222 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar283._8_4_ = fVar222 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar283._12_4_ = fVar222 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar150._0_4_ = fVar222 * auVar86._0_4_;
  auVar150._4_4_ = fVar222 * auVar86._4_4_;
  auVar150._8_4_ = fVar222 * auVar86._8_4_;
  auVar150._12_4_ = fVar222 * auVar86._12_4_;
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xb + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6)));
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar7 * 0xc + uVar69 + 6)));
  auVar179 = vcvtdq2ps_avx(auVar179);
  uVar62 = (ulong)(uint)((int)(uVar69 * 9) * 2);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 + uVar69 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar62 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar73 = vshufps_avx(auVar283,auVar283,0);
  auVar120 = vshufps_avx(auVar283,auVar283,0x55);
  auVar151 = vshufps_avx(auVar283,auVar283,0xaa);
  fVar222 = auVar151._0_4_;
  fVar168 = auVar151._4_4_;
  fVar242 = auVar151._8_4_;
  fVar189 = auVar151._12_4_;
  fVar258 = auVar120._0_4_;
  fVar269 = auVar120._4_4_;
  fVar271 = auVar120._8_4_;
  fVar274 = auVar120._12_4_;
  fVar245 = auVar73._0_4_;
  fVar190 = auVar73._4_4_;
  fVar248 = auVar73._8_4_;
  fVar191 = auVar73._12_4_;
  auVar328._0_4_ = fVar245 * auVar86._0_4_ + fVar258 * auVar12._0_4_ + fVar222 * auVar79._0_4_;
  auVar328._4_4_ = fVar190 * auVar86._4_4_ + fVar269 * auVar12._4_4_ + fVar168 * auVar79._4_4_;
  auVar328._8_4_ = fVar248 * auVar86._8_4_ + fVar271 * auVar12._8_4_ + fVar242 * auVar79._8_4_;
  auVar328._12_4_ = fVar191 * auVar86._12_4_ + fVar274 * auVar12._12_4_ + fVar189 * auVar79._12_4_;
  auVar342._0_4_ = fVar245 * auVar83._0_4_ + fVar258 * auVar156._0_4_ + auVar179._0_4_ * fVar222;
  auVar342._4_4_ = fVar190 * auVar83._4_4_ + fVar269 * auVar156._4_4_ + auVar179._4_4_ * fVar168;
  auVar342._8_4_ = fVar248 * auVar83._8_4_ + fVar271 * auVar156._8_4_ + auVar179._8_4_ * fVar242;
  auVar342._12_4_ = fVar191 * auVar83._12_4_ + fVar274 * auVar156._12_4_ + auVar179._12_4_ * fVar189
  ;
  auVar284._0_4_ = fVar245 * auVar81._0_4_ + fVar258 * auVar74._0_4_ + auVar85._0_4_ * fVar222;
  auVar284._4_4_ = fVar190 * auVar81._4_4_ + fVar269 * auVar74._4_4_ + auVar85._4_4_ * fVar168;
  auVar284._8_4_ = fVar248 * auVar81._8_4_ + fVar271 * auVar74._8_4_ + auVar85._8_4_ * fVar242;
  auVar284._12_4_ = fVar191 * auVar81._12_4_ + fVar274 * auVar74._12_4_ + auVar85._12_4_ * fVar189;
  auVar73 = vshufps_avx(auVar150,auVar150,0);
  auVar120 = vshufps_avx(auVar150,auVar150,0x55);
  auVar151 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar222 = auVar151._0_4_;
  fVar168 = auVar151._4_4_;
  fVar242 = auVar151._8_4_;
  fVar189 = auVar151._12_4_;
  fVar258 = auVar120._0_4_;
  fVar269 = auVar120._4_4_;
  fVar271 = auVar120._8_4_;
  fVar274 = auVar120._12_4_;
  fVar245 = auVar73._0_4_;
  fVar190 = auVar73._4_4_;
  fVar248 = auVar73._8_4_;
  fVar191 = auVar73._12_4_;
  auVar199._0_4_ = fVar245 * auVar86._0_4_ + fVar258 * auVar12._0_4_ + fVar222 * auVar79._0_4_;
  auVar199._4_4_ = fVar190 * auVar86._4_4_ + fVar269 * auVar12._4_4_ + fVar168 * auVar79._4_4_;
  auVar199._8_4_ = fVar248 * auVar86._8_4_ + fVar271 * auVar12._8_4_ + fVar242 * auVar79._8_4_;
  auVar199._12_4_ = fVar191 * auVar86._12_4_ + fVar274 * auVar12._12_4_ + fVar189 * auVar79._12_4_;
  auVar120._0_4_ = fVar245 * auVar83._0_4_ + auVar179._0_4_ * fVar222 + fVar258 * auVar156._0_4_;
  auVar120._4_4_ = fVar190 * auVar83._4_4_ + auVar179._4_4_ * fVar168 + fVar269 * auVar156._4_4_;
  auVar120._8_4_ = fVar248 * auVar83._8_4_ + auVar179._8_4_ * fVar242 + fVar271 * auVar156._8_4_;
  auVar120._12_4_ = fVar191 * auVar83._12_4_ + auVar179._12_4_ * fVar189 + fVar274 * auVar156._12_4_
  ;
  auVar73._0_4_ = fVar245 * auVar81._0_4_ + fVar258 * auVar74._0_4_ + auVar85._0_4_ * fVar222;
  auVar73._4_4_ = fVar190 * auVar81._4_4_ + fVar269 * auVar74._4_4_ + auVar85._4_4_ * fVar168;
  auVar73._8_4_ = fVar248 * auVar81._8_4_ + fVar271 * auVar74._8_4_ + auVar85._8_4_ * fVar242;
  auVar73._12_4_ = fVar191 * auVar81._12_4_ + fVar274 * auVar74._12_4_ + auVar85._12_4_ * fVar189;
  auVar260._8_4_ = 0x7fffffff;
  auVar260._0_8_ = 0x7fffffff7fffffff;
  auVar260._12_4_ = 0x7fffffff;
  auVar86 = vandps_avx(auVar328,auVar260);
  auVar169._8_4_ = 0x219392ef;
  auVar169._0_8_ = 0x219392ef219392ef;
  auVar169._12_4_ = 0x219392ef;
  auVar86 = vcmpps_avx(auVar86,auVar169,1);
  auVar12 = vblendvps_avx(auVar328,auVar169,auVar86);
  auVar86 = vandps_avx(auVar342,auVar260);
  auVar86 = vcmpps_avx(auVar86,auVar169,1);
  auVar79 = vblendvps_avx(auVar342,auVar169,auVar86);
  auVar86 = vandps_avx(auVar284,auVar260);
  auVar86 = vcmpps_avx(auVar86,auVar169,1);
  auVar86 = vblendvps_avx(auVar284,auVar169,auVar86);
  auVar83 = vrcpps_avx(auVar12);
  fVar258 = auVar83._0_4_;
  auVar151._0_4_ = fVar258 * auVar12._0_4_;
  fVar269 = auVar83._4_4_;
  auVar151._4_4_ = fVar269 * auVar12._4_4_;
  fVar271 = auVar83._8_4_;
  auVar151._8_4_ = fVar271 * auVar12._8_4_;
  fVar274 = auVar83._12_4_;
  auVar151._12_4_ = fVar274 * auVar12._12_4_;
  auVar285._8_4_ = 0x3f800000;
  auVar285._0_8_ = 0x3f8000003f800000;
  auVar285._12_4_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar285,auVar151);
  fVar258 = fVar258 + fVar258 * auVar12._0_4_;
  fVar269 = fVar269 + fVar269 * auVar12._4_4_;
  fVar271 = fVar271 + fVar271 * auVar12._8_4_;
  fVar274 = fVar274 + fVar274 * auVar12._12_4_;
  auVar12 = vrcpps_avx(auVar79);
  fVar222 = auVar12._0_4_;
  auVar225._0_4_ = fVar222 * auVar79._0_4_;
  fVar242 = auVar12._4_4_;
  auVar225._4_4_ = fVar242 * auVar79._4_4_;
  fVar245 = auVar12._8_4_;
  auVar225._8_4_ = fVar245 * auVar79._8_4_;
  fVar248 = auVar12._12_4_;
  auVar225._12_4_ = fVar248 * auVar79._12_4_;
  auVar12 = vsubps_avx(auVar285,auVar225);
  fVar222 = fVar222 + fVar222 * auVar12._0_4_;
  fVar242 = fVar242 + fVar242 * auVar12._4_4_;
  fVar245 = fVar245 + fVar245 * auVar12._8_4_;
  fVar248 = fVar248 + fVar248 * auVar12._12_4_;
  auVar12 = vrcpps_avx(auVar86);
  fVar168 = auVar12._0_4_;
  auVar170._0_4_ = fVar168 * auVar86._0_4_;
  fVar189 = auVar12._4_4_;
  auVar170._4_4_ = fVar189 * auVar86._4_4_;
  fVar190 = auVar12._8_4_;
  auVar170._8_4_ = fVar190 * auVar86._8_4_;
  fVar191 = auVar12._12_4_;
  auVar170._12_4_ = fVar191 * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar285,auVar170);
  fVar168 = fVar168 + fVar168 * auVar86._0_4_;
  fVar189 = fVar189 + fVar189 * auVar86._4_4_;
  fVar190 = fVar190 + fVar190 * auVar86._8_4_;
  fVar191 = fVar191 + fVar191 * auVar86._12_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar86 = vpmovsxwd_avx(auVar86);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar199);
  auVar152._0_4_ = fVar258 * auVar86._0_4_;
  auVar152._4_4_ = fVar269 * auVar86._4_4_;
  auVar152._8_4_ = fVar271 * auVar86._8_4_;
  auVar152._12_4_ = fVar274 * auVar86._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar86 = vpmovsxwd_avx(auVar12);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar199);
  auVar200._0_4_ = fVar258 * auVar86._0_4_;
  auVar200._4_4_ = fVar269 * auVar86._4_4_;
  auVar200._8_4_ = fVar271 * auVar86._8_4_;
  auVar200._12_4_ = fVar274 * auVar86._12_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar79);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar69 * -2 + 6);
  auVar86 = vpmovsxwd_avx(auVar83);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar120);
  auVar297._0_4_ = auVar86._0_4_ * fVar222;
  auVar297._4_4_ = auVar86._4_4_ * fVar242;
  auVar297._8_4_ = auVar86._8_4_ * fVar245;
  auVar297._12_4_ = auVar86._12_4_ * fVar248;
  auVar86 = vcvtdq2ps_avx(auVar12);
  auVar86 = vsubps_avx(auVar86,auVar120);
  auVar85._0_4_ = fVar222 * auVar86._0_4_;
  auVar85._4_4_ = fVar242 * auVar86._4_4_;
  auVar85._8_4_ = fVar245 * auVar86._8_4_;
  auVar85._12_4_ = fVar248 * auVar86._12_4_;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar62 + uVar69 + 6);
  auVar86 = vpmovsxwd_avx(auVar156);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar73);
  auVar226._0_4_ = auVar86._0_4_ * fVar168;
  auVar226._4_4_ = auVar86._4_4_ * fVar189;
  auVar226._8_4_ = auVar86._8_4_ * fVar190;
  auVar226._12_4_ = auVar86._12_4_ * fVar191;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar69 * 0x17 + 6);
  auVar86 = vpmovsxwd_avx(auVar179);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar73);
  auVar81._0_4_ = auVar86._0_4_ * fVar168;
  auVar81._4_4_ = auVar86._4_4_ * fVar189;
  auVar81._8_4_ = auVar86._8_4_ * fVar190;
  auVar81._12_4_ = auVar86._12_4_ * fVar191;
  auVar86 = vpminsd_avx(auVar152,auVar200);
  auVar12 = vpminsd_avx(auVar297,auVar85);
  auVar86 = vmaxps_avx(auVar86,auVar12);
  auVar12 = vpminsd_avx(auVar226,auVar81);
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar302._4_4_ = uVar2;
  auVar302._0_4_ = uVar2;
  auVar302._8_4_ = uVar2;
  auVar302._12_4_ = uVar2;
  auVar12 = vmaxps_avx(auVar12,auVar302);
  auVar86 = vmaxps_avx(auVar86,auVar12);
  local_4a0._0_4_ = auVar86._0_4_ * 0.99999964;
  local_4a0._4_4_ = auVar86._4_4_ * 0.99999964;
  local_4a0._8_4_ = auVar86._8_4_ * 0.99999964;
  local_4a0._12_4_ = auVar86._12_4_ * 0.99999964;
  auVar86 = vpmaxsd_avx(auVar152,auVar200);
  auVar12 = vpmaxsd_avx(auVar297,auVar85);
  auVar86 = vminps_avx(auVar86,auVar12);
  auVar12 = vpmaxsd_avx(auVar226,auVar81);
  fVar222 = (ray->super_RayK<1>).tfar;
  auVar153._4_4_ = fVar222;
  auVar153._0_4_ = fVar222;
  auVar153._8_4_ = fVar222;
  auVar153._12_4_ = fVar222;
  auVar12 = vminps_avx(auVar12,auVar153);
  auVar86 = vminps_avx(auVar86,auVar12);
  auVar74._0_4_ = auVar86._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar86._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar86._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar86._12_4_ * 1.0000004;
  auVar86 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar12 = vpcmpgtd_avx(auVar86,_DAT_01f7fcf0);
  auVar86 = vcmpps_avx(local_4a0,auVar74,2);
  auVar86 = vandps_avx(auVar86,auVar12);
  uVar60 = vmovmskps_avx(auVar86);
  if (uVar60 == 0) {
    return;
  }
  uVar60 = uVar60 & 0xff;
  auVar87._16_16_ = mm_lookupmask_ps._240_16_;
  auVar87._0_16_ = mm_lookupmask_ps._240_16_;
  local_360 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,0x80);
LAB_00e4167e:
  lVar67 = 0;
  if (uVar60 != 0) {
    for (; (uVar60 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  uVar66 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar66].ptr;
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar67 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar86 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * uVar62);
  auVar12 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * (uVar62 + 1));
  pfVar1 = (float *)(pGVar8[2].intersectionFilterN + uVar62 * (long)pGVar8[2].pointQueryFunc);
  auVar201._0_4_ = auVar86._0_4_ + *pfVar1 * 0.33333334;
  auVar201._4_4_ = auVar86._4_4_ + pfVar1[1] * 0.33333334;
  auVar201._8_4_ = auVar86._8_4_ + pfVar1[2] * 0.33333334;
  auVar201._12_4_ = auVar86._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * (uVar62 + 1));
  auVar75._0_4_ = *pfVar1 * 0.33333334;
  auVar75._4_4_ = pfVar1[1] * 0.33333334;
  auVar75._8_4_ = pfVar1[2] * 0.33333334;
  auVar75._12_4_ = pfVar1[3] * 0.33333334;
  auVar179 = vsubps_avx(auVar12,auVar75);
  auVar76._0_4_ = (auVar12._0_4_ + auVar86._0_4_ + auVar201._0_4_ + auVar179._0_4_) * 0.25;
  auVar76._4_4_ = (auVar12._4_4_ + auVar86._4_4_ + auVar201._4_4_ + auVar179._4_4_) * 0.25;
  auVar76._8_4_ = (auVar12._8_4_ + auVar86._8_4_ + auVar201._8_4_ + auVar179._8_4_) * 0.25;
  auVar76._12_4_ = (auVar12._12_4_ + auVar86._12_4_ + auVar201._12_4_ + auVar179._12_4_) * 0.25;
  aVar4 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar5 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar79 = vsubps_avx(auVar76,(undefined1  [16])aVar4);
  auVar79 = vdpps_avx(auVar79,(undefined1  [16])aVar5,0x7f);
  auVar83 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  auVar156 = vrcpss_avx(auVar83,auVar83);
  fVar222 = auVar79._0_4_ * auVar156._0_4_ * (2.0 - auVar156._0_4_ * auVar83._0_4_);
  local_770 = ZEXT416((uint)fVar222);
  auVar83 = vshufps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),0);
  fVar222 = aVar5.x;
  fVar189 = fVar222 * auVar83._0_4_;
  fVar168 = aVar5.y;
  fVar245 = fVar168 * auVar83._4_4_;
  fVar242 = aVar5.z;
  fVar190 = fVar242 * auVar83._8_4_;
  aVar144 = aVar5.field_3;
  fVar248 = aVar144.w * auVar83._12_4_;
  auVar296 = ZEXT1664(CONCAT412(fVar248,CONCAT48(fVar190,CONCAT44(fVar245,fVar189))));
  auVar261._0_4_ = aVar4.x + fVar189;
  auVar261._4_4_ = aVar4.y + fVar245;
  auVar261._8_4_ = aVar4.z + fVar190;
  auVar261._12_4_ = aVar4.field_3.w + fVar248;
  auVar79 = vblendps_avx(auVar261,_DAT_01f7aa10,8);
  _local_950 = vsubps_avx(auVar86,auVar79);
  _local_960 = vsubps_avx(auVar179,auVar79);
  _local_970 = vsubps_avx(auVar201,auVar79);
  _local_980 = vsubps_avx(auVar12,auVar79);
  auVar268 = ZEXT1664(_local_980);
  auVar86 = vshufps_avx(_local_950,_local_950,0);
  local_9c0._16_16_ = auVar86;
  local_9c0._0_16_ = auVar86;
  auVar367 = ZEXT3264(local_9c0);
  auVar86 = vshufps_avx(_local_950,_local_950,0x55);
  local_9e0._16_16_ = auVar86;
  local_9e0._0_16_ = auVar86;
  auVar314 = ZEXT3264(local_9e0);
  auVar86 = vshufps_avx(_local_950,_local_950,0xaa);
  local_a00._16_16_ = auVar86;
  local_a00._0_16_ = auVar86;
  auVar318 = ZEXT3264(local_a00);
  auVar86 = vshufps_avx(_local_950,_local_950,0xff);
  local_900._16_16_ = auVar86;
  local_900._0_16_ = auVar86;
  auVar365 = ZEXT3264(local_900);
  auVar86 = vshufps_avx(_local_970,_local_970,0);
  auVar329._16_16_ = auVar86;
  auVar329._0_16_ = auVar86;
  auVar86 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001290 = auVar86;
  _local_1e0 = auVar86;
  auVar86 = vshufps_avx(_local_970,_local_970,0xaa);
  local_9a0._16_16_ = auVar86;
  local_9a0._0_16_ = auVar86;
  auVar345 = ZEXT3264(local_9a0);
  auVar121._0_4_ = fVar222 * fVar222;
  auVar121._4_4_ = fVar168 * fVar168;
  auVar121._8_4_ = fVar242 * fVar242;
  auVar121._12_4_ = aVar144.w * aVar144.w;
  auVar86 = vshufps_avx(auVar121,auVar121,0xaa);
  auVar12 = vshufps_avx(auVar121,auVar121,0x55);
  auVar79 = vshufps_avx(_local_970,_local_970,0xff);
  local_920._16_16_ = auVar79;
  local_920._0_16_ = auVar79;
  auVar307 = ZEXT3264(local_920);
  auVar79 = vshufps_avx(auVar121,auVar121,0);
  local_200._0_4_ = auVar79._0_4_ + auVar12._0_4_ + auVar86._0_4_;
  local_200._4_4_ = auVar79._4_4_ + auVar12._4_4_ + auVar86._4_4_;
  local_200._8_4_ = auVar79._8_4_ + auVar12._8_4_ + auVar86._8_4_;
  local_200._12_4_ = auVar79._12_4_ + auVar12._12_4_ + auVar86._12_4_;
  local_200._16_4_ = auVar79._0_4_ + auVar12._0_4_ + auVar86._0_4_;
  local_200._20_4_ = auVar79._4_4_ + auVar12._4_4_ + auVar86._4_4_;
  local_200._24_4_ = auVar79._8_4_ + auVar12._8_4_ + auVar86._8_4_;
  local_200._28_4_ = auVar79._12_4_ + auVar12._12_4_ + auVar86._12_4_;
  auVar86 = vshufps_avx(_local_960,_local_960,0);
  register0x00001250 = auVar86;
  _local_220 = auVar86;
  auVar86 = vshufps_avx(_local_960,_local_960,0x55);
  register0x00001250 = auVar86;
  _local_240 = auVar86;
  auVar86 = vshufps_avx(_local_960,_local_960,0xaa);
  register0x00001250 = auVar86;
  _local_260 = auVar86;
  auVar86 = vshufps_avx(_local_960,_local_960,0xff);
  register0x00001250 = auVar86;
  _local_280 = auVar86;
  auVar86 = vshufps_avx(_local_980,_local_980,0);
  register0x00001250 = auVar86;
  _local_2a0 = auVar86;
  auVar86 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001250 = auVar86;
  _local_2c0 = auVar86;
  auVar86 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001250 = auVar86;
  _local_2e0 = auVar86;
  auVar86 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001250 = auVar86;
  _local_300 = auVar86;
  register0x00001210 = auVar83;
  _local_640 = auVar83;
  local_b0c = 1;
  uVar69 = 0;
  local_6e0 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_6dc = local_6e0;
  fStack_6d8 = local_6e0;
  fStack_6d4 = local_6e0;
  fStack_6d0 = local_6e0;
  fStack_6cc = local_6e0;
  fStack_6c8 = local_6e0;
  fStack_6c4 = local_6e0;
  local_700 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_6fc = local_700;
  fStack_6f8 = local_700;
  fStack_6f4 = local_700;
  fStack_6f0 = local_700;
  fStack_6ec = local_700;
  fStack_6e8 = local_700;
  fStack_6e4 = local_700;
  local_720 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_71c = local_720;
  fStack_718 = local_720;
  fStack_714 = local_720;
  fStack_710 = local_720;
  fStack_70c = local_720;
  fStack_708 = local_720;
  fStack_704 = local_720;
  auVar88._8_4_ = 0x7fffffff;
  auVar88._0_8_ = 0x7fffffff7fffffff;
  auVar88._12_4_ = 0x7fffffff;
  auVar88._16_4_ = 0x7fffffff;
  auVar88._20_4_ = 0x7fffffff;
  auVar88._24_4_ = 0x7fffffff;
  auVar88._28_4_ = 0x7fffffff;
  local_3a0 = vandps_avx(local_200,auVar88);
  local_490 = ZEXT816(0x3f80000000000000);
  local_380 = auVar329;
  uVar62 = (ulong)*(uint *)(prim + lVar67 * 4 + 6);
  do {
    auVar184._8_4_ = 0x3f800000;
    auVar184._0_8_ = 0x3f8000003f800000;
    auVar184._12_4_ = 0x3f800000;
    auVar184._16_4_ = 0x3f800000;
    auVar184._20_4_ = 0x3f800000;
    iVar68 = (int)uVar69;
    auVar184._24_4_ = 0x3f800000;
    auVar184._28_4_ = 0x3f800000;
    auVar86 = vmovshdup_avx(local_490);
    auVar79 = vsubps_avx(auVar86,local_490);
    auVar86 = vshufps_avx(local_490,local_490,0);
    local_800._16_16_ = auVar86;
    local_800._0_16_ = auVar86;
    auVar12 = vshufps_avx(auVar79,auVar79,0);
    local_660._16_16_ = auVar12;
    local_660._0_16_ = auVar12;
    fVar118 = auVar12._0_4_;
    fVar140 = auVar12._4_4_;
    fVar142 = auVar12._8_4_;
    fVar145 = auVar12._12_4_;
    fVar70 = auVar86._0_4_;
    auVar132._0_4_ = fVar70 + fVar118 * 0.0;
    fVar97 = auVar86._4_4_;
    auVar132._4_4_ = fVar97 + fVar140 * 0.14285715;
    fVar101 = auVar86._8_4_;
    auVar132._8_4_ = fVar101 + fVar142 * 0.2857143;
    fVar104 = auVar86._12_4_;
    auVar132._12_4_ = fVar104 + fVar145 * 0.42857146;
    auVar132._16_4_ = fVar70 + fVar118 * 0.5714286;
    auVar132._20_4_ = fVar97 + fVar140 * 0.71428573;
    auVar132._24_4_ = fVar101 + fVar142 * 0.8571429;
    auVar132._28_4_ = fVar104 + fVar145;
    auVar87 = vsubps_avx(auVar184,auVar132);
    fVar191 = auVar329._28_4_;
    fVar222 = auVar87._0_4_;
    fVar168 = auVar87._4_4_;
    fVar242 = auVar87._8_4_;
    fVar189 = auVar87._12_4_;
    fVar245 = auVar87._16_4_;
    fVar190 = auVar87._20_4_;
    fVar248 = auVar87._24_4_;
    fVar195 = auVar296._28_4_ + 1.0;
    fVar196 = auVar268._28_4_ + fVar191 + fVar195;
    fVar259 = (float)local_220._0_4_ * auVar132._0_4_ + auVar329._0_4_ * fVar222;
    fVar270 = (float)local_220._4_4_ * auVar132._4_4_ + auVar329._4_4_ * fVar168;
    fVar272 = fStack_218 * auVar132._8_4_ + auVar329._8_4_ * fVar242;
    fVar275 = fStack_214 * auVar132._12_4_ + auVar329._12_4_ * fVar189;
    fVar277 = fStack_210 * auVar132._16_4_ + auVar329._16_4_ * fVar245;
    fVar279 = fStack_20c * auVar132._20_4_ + auVar329._20_4_ * fVar190;
    fVar281 = fStack_208 * auVar132._24_4_ + auVar329._24_4_ * fVar248;
    fVar258 = (float)local_240._0_4_ * auVar132._0_4_ + (float)local_1e0._0_4_ * fVar222;
    fVar269 = (float)local_240._4_4_ * auVar132._4_4_ + (float)local_1e0._4_4_ * fVar168;
    fVar271 = fStack_238 * auVar132._8_4_ + fStack_1d8 * fVar242;
    fVar274 = fStack_234 * auVar132._12_4_ + fStack_1d4 * fVar189;
    fVar192 = fStack_230 * auVar132._16_4_ + fStack_1d0 * fVar245;
    fVar193 = fStack_22c * auVar132._20_4_ + fStack_1cc * fVar190;
    fVar194 = fStack_228 * auVar132._24_4_ + fStack_1c8 * fVar248;
    fVar198 = (float)local_260._0_4_ * auVar132._0_4_ + auVar345._0_4_ * fVar222;
    fVar216 = (float)local_260._4_4_ * auVar132._4_4_ + auVar345._4_4_ * fVar168;
    fVar217 = fStack_258 * auVar132._8_4_ + auVar345._8_4_ * fVar242;
    fVar218 = fStack_254 * auVar132._12_4_ + auVar345._12_4_ * fVar189;
    fVar219 = fStack_250 * auVar132._16_4_ + auVar345._16_4_ * fVar245;
    fVar220 = fStack_24c * auVar132._20_4_ + auVar345._20_4_ * fVar190;
    fVar221 = fStack_248 * auVar132._24_4_ + auVar345._24_4_ * fVar248;
    fVar223 = (float)local_280._0_4_ * auVar132._0_4_ + auVar307._0_4_ * fVar222;
    fVar243 = (float)local_280._4_4_ * auVar132._4_4_ + auVar307._4_4_ * fVar168;
    fVar246 = fStack_278 * auVar132._8_4_ + auVar307._8_4_ * fVar242;
    fVar249 = fStack_274 * auVar132._12_4_ + auVar307._12_4_ * fVar189;
    fVar251 = fStack_270 * auVar132._16_4_ + auVar307._16_4_ * fVar245;
    fVar253 = fStack_26c * auVar132._20_4_ + auVar307._20_4_ * fVar190;
    fVar255 = fStack_268 * auVar132._24_4_ + auVar307._24_4_ * fVar248;
    fVar325 = auVar318._28_4_;
    fVar361 = fVar325 + auVar345._28_4_;
    fVar339 = fVar191 + fVar325;
    auVar305._0_4_ =
         fVar222 * (auVar329._0_4_ * auVar132._0_4_ + auVar367._0_4_ * fVar222) +
         auVar132._0_4_ * fVar259;
    auVar305._4_4_ =
         fVar168 * (auVar329._4_4_ * auVar132._4_4_ + auVar367._4_4_ * fVar168) +
         auVar132._4_4_ * fVar270;
    auVar305._8_4_ =
         fVar242 * (auVar329._8_4_ * auVar132._8_4_ + auVar367._8_4_ * fVar242) +
         auVar132._8_4_ * fVar272;
    auVar305._12_4_ =
         fVar189 * (auVar329._12_4_ * auVar132._12_4_ + auVar367._12_4_ * fVar189) +
         auVar132._12_4_ * fVar275;
    auVar305._16_4_ =
         fVar245 * (auVar329._16_4_ * auVar132._16_4_ + auVar367._16_4_ * fVar245) +
         auVar132._16_4_ * fVar277;
    auVar305._20_4_ =
         fVar190 * (auVar329._20_4_ * auVar132._20_4_ + auVar367._20_4_ * fVar190) +
         auVar132._20_4_ * fVar279;
    auVar305._24_4_ =
         fVar248 * (auVar329._24_4_ * auVar132._24_4_ + auVar367._24_4_ * fVar248) +
         auVar132._24_4_ * fVar281;
    auVar305._28_4_ = auVar307._28_4_ + fVar325;
    auVar311._0_4_ =
         ((float)local_1e0._0_4_ * auVar132._0_4_ + auVar314._0_4_ * fVar222) * fVar222 +
         auVar132._0_4_ * fVar258;
    auVar311._4_4_ =
         ((float)local_1e0._4_4_ * auVar132._4_4_ + auVar314._4_4_ * fVar168) * fVar168 +
         auVar132._4_4_ * fVar269;
    auVar311._8_4_ =
         (fStack_1d8 * auVar132._8_4_ + auVar314._8_4_ * fVar242) * fVar242 +
         auVar132._8_4_ * fVar271;
    auVar311._12_4_ =
         (fStack_1d4 * auVar132._12_4_ + auVar314._12_4_ * fVar189) * fVar189 +
         auVar132._12_4_ * fVar274;
    auVar311._16_4_ =
         (fStack_1d0 * auVar132._16_4_ + auVar314._16_4_ * fVar245) * fVar245 +
         auVar132._16_4_ * fVar192;
    auVar311._20_4_ =
         (fStack_1cc * auVar132._20_4_ + auVar314._20_4_ * fVar190) * fVar190 +
         auVar132._20_4_ * fVar193;
    auVar311._24_4_ =
         (fStack_1c8 * auVar132._24_4_ + auVar314._24_4_ * fVar248) * fVar248 +
         auVar132._24_4_ * fVar194;
    auVar311._28_4_ = fVar195 + 1.0 + fVar325;
    auVar316._0_4_ =
         fVar222 * (auVar345._0_4_ * auVar132._0_4_ + auVar318._0_4_ * fVar222) +
         auVar132._0_4_ * fVar198;
    auVar316._4_4_ =
         fVar168 * (auVar345._4_4_ * auVar132._4_4_ + auVar318._4_4_ * fVar168) +
         auVar132._4_4_ * fVar216;
    auVar316._8_4_ =
         fVar242 * (auVar345._8_4_ * auVar132._8_4_ + auVar318._8_4_ * fVar242) +
         auVar132._8_4_ * fVar217;
    auVar316._12_4_ =
         fVar189 * (auVar345._12_4_ * auVar132._12_4_ + auVar318._12_4_ * fVar189) +
         auVar132._12_4_ * fVar218;
    auVar316._16_4_ =
         fVar245 * (auVar345._16_4_ * auVar132._16_4_ + auVar318._16_4_ * fVar245) +
         auVar132._16_4_ * fVar219;
    auVar316._20_4_ =
         fVar190 * (auVar345._20_4_ * auVar132._20_4_ + auVar318._20_4_ * fVar190) +
         auVar132._20_4_ * fVar220;
    auVar316._24_4_ =
         fVar248 * (auVar345._24_4_ * auVar132._24_4_ + auVar318._24_4_ * fVar248) +
         auVar132._24_4_ * fVar221;
    auVar316._28_4_ = fStack_204 + fVar325;
    auVar288._0_4_ =
         auVar132._0_4_ * fVar223 +
         fVar222 * (auVar307._0_4_ * auVar132._0_4_ + auVar365._0_4_ * fVar222);
    auVar288._4_4_ =
         auVar132._4_4_ * fVar243 +
         fVar168 * (auVar307._4_4_ * auVar132._4_4_ + auVar365._4_4_ * fVar168);
    auVar288._8_4_ =
         auVar132._8_4_ * fVar246 +
         fVar242 * (auVar307._8_4_ * auVar132._8_4_ + auVar365._8_4_ * fVar242);
    auVar288._12_4_ =
         auVar132._12_4_ * fVar249 +
         fVar189 * (auVar307._12_4_ * auVar132._12_4_ + auVar365._12_4_ * fVar189);
    auVar288._16_4_ =
         auVar132._16_4_ * fVar251 +
         fVar245 * (auVar307._16_4_ * auVar132._16_4_ + auVar365._16_4_ * fVar245);
    auVar288._20_4_ =
         auVar132._20_4_ * fVar253 +
         fVar190 * (auVar307._20_4_ * auVar132._20_4_ + auVar365._20_4_ * fVar190);
    auVar288._24_4_ =
         auVar132._24_4_ * fVar255 +
         fVar248 * (auVar307._24_4_ * auVar132._24_4_ + auVar365._24_4_ * fVar248);
    auVar288._28_4_ = fStack_204 + fStack_264;
    auVar264._0_4_ =
         (auVar132._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar222) *
         auVar132._0_4_ + fVar222 * fVar259;
    auVar264._4_4_ =
         (auVar132._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar168) *
         auVar132._4_4_ + fVar168 * fVar270;
    auVar264._8_4_ =
         (auVar132._8_4_ * fStack_298 + fStack_218 * fVar242) * auVar132._8_4_ + fVar242 * fVar272;
    auVar264._12_4_ =
         (auVar132._12_4_ * fStack_294 + fStack_214 * fVar189) * auVar132._12_4_ + fVar189 * fVar275
    ;
    auVar264._16_4_ =
         (auVar132._16_4_ * fStack_290 + fStack_210 * fVar245) * auVar132._16_4_ + fVar245 * fVar277
    ;
    auVar264._20_4_ =
         (auVar132._20_4_ * fStack_28c + fStack_20c * fVar190) * auVar132._20_4_ + fVar190 * fVar279
    ;
    auVar264._24_4_ =
         (auVar132._24_4_ * fStack_288 + fStack_208 * fVar248) * auVar132._24_4_ + fVar248 * fVar281
    ;
    auVar264._28_4_ = fStack_204 + fVar196 + auVar268._28_4_;
    auVar185._0_4_ =
         (auVar132._0_4_ * (float)local_2c0._0_4_ + (float)local_240._0_4_ * fVar222) *
         auVar132._0_4_ + fVar222 * fVar258;
    auVar185._4_4_ =
         (auVar132._4_4_ * (float)local_2c0._4_4_ + (float)local_240._4_4_ * fVar168) *
         auVar132._4_4_ + fVar168 * fVar269;
    auVar185._8_4_ =
         (auVar132._8_4_ * fStack_2b8 + fStack_238 * fVar242) * auVar132._8_4_ + fVar242 * fVar271;
    auVar185._12_4_ =
         (auVar132._12_4_ * fStack_2b4 + fStack_234 * fVar189) * auVar132._12_4_ + fVar189 * fVar274
    ;
    auVar185._16_4_ =
         (auVar132._16_4_ * fStack_2b0 + fStack_230 * fVar245) * auVar132._16_4_ + fVar245 * fVar192
    ;
    auVar185._20_4_ =
         (auVar132._20_4_ * fStack_2ac + fStack_22c * fVar190) * auVar132._20_4_ + fVar190 * fVar193
    ;
    auVar185._24_4_ =
         (auVar132._24_4_ * fStack_2a8 + fStack_228 * fVar248) * auVar132._24_4_ + fVar248 * fVar194
    ;
    auVar185._28_4_ = fStack_204 + fVar196 + 1.0;
    auVar210._0_4_ =
         (auVar132._0_4_ * (float)local_2e0._0_4_ + (float)local_260._0_4_ * fVar222) *
         auVar132._0_4_ + fVar222 * fVar198;
    auVar210._4_4_ =
         (auVar132._4_4_ * (float)local_2e0._4_4_ + (float)local_260._4_4_ * fVar168) *
         auVar132._4_4_ + fVar168 * fVar216;
    auVar210._8_4_ =
         (auVar132._8_4_ * fStack_2d8 + fStack_258 * fVar242) * auVar132._8_4_ + fVar242 * fVar217;
    auVar210._12_4_ =
         (auVar132._12_4_ * fStack_2d4 + fStack_254 * fVar189) * auVar132._12_4_ + fVar189 * fVar218
    ;
    auVar210._16_4_ =
         (auVar132._16_4_ * fStack_2d0 + fStack_250 * fVar245) * auVar132._16_4_ + fVar245 * fVar219
    ;
    auVar210._20_4_ =
         (auVar132._20_4_ * fStack_2cc + fStack_24c * fVar190) * auVar132._20_4_ + fVar190 * fVar220
    ;
    auVar210._24_4_ =
         (auVar132._24_4_ * fStack_2c8 + fStack_248 * fVar248) * auVar132._24_4_ + fVar248 * fVar221
    ;
    auVar210._28_4_ = fVar339 + fVar191 + 1.0;
    auVar231._0_4_ =
         (auVar132._0_4_ * (float)local_300._0_4_ + (float)local_280._0_4_ * fVar222) *
         auVar132._0_4_ + fVar222 * fVar223;
    auVar231._4_4_ =
         (auVar132._4_4_ * (float)local_300._4_4_ + (float)local_280._4_4_ * fVar168) *
         auVar132._4_4_ + fVar168 * fVar243;
    auVar231._8_4_ =
         (auVar132._8_4_ * fStack_2f8 + fStack_278 * fVar242) * auVar132._8_4_ + fVar242 * fVar246;
    auVar231._12_4_ =
         (auVar132._12_4_ * fStack_2f4 + fStack_274 * fVar189) * auVar132._12_4_ + fVar189 * fVar249
    ;
    auVar231._16_4_ =
         (auVar132._16_4_ * fStack_2f0 + fStack_270 * fVar245) * auVar132._16_4_ + fVar245 * fVar251
    ;
    auVar231._20_4_ =
         (auVar132._20_4_ * fStack_2ec + fStack_26c * fVar190) * auVar132._20_4_ + fVar190 * fVar253
    ;
    auVar231._24_4_ =
         (auVar132._24_4_ * fStack_2e8 + fStack_268 * fVar248) * auVar132._24_4_ + fVar248 * fVar255
    ;
    auVar231._28_4_ = fVar361 + fVar325 + fVar191;
    fVar71 = auVar305._0_4_ * fVar222 + auVar132._0_4_ * auVar264._0_4_;
    fVar98 = auVar305._4_4_ * fVar168 + auVar132._4_4_ * auVar264._4_4_;
    fVar102 = auVar305._8_4_ * fVar242 + auVar132._8_4_ * auVar264._8_4_;
    fVar105 = auVar305._12_4_ * fVar189 + auVar132._12_4_ * auVar264._12_4_;
    fVar108 = auVar305._16_4_ * fVar245 + auVar132._16_4_ * auVar264._16_4_;
    fVar111 = auVar305._20_4_ * fVar190 + auVar132._20_4_ * auVar264._20_4_;
    fVar114 = auVar305._24_4_ * fVar248 + auVar132._24_4_ * auVar264._24_4_;
    fVar117 = fVar361 + fStack_204;
    local_600._0_4_ = auVar311._0_4_ * fVar222 + auVar132._0_4_ * auVar185._0_4_;
    local_600._4_4_ = auVar311._4_4_ * fVar168 + auVar132._4_4_ * auVar185._4_4_;
    local_600._8_4_ = auVar311._8_4_ * fVar242 + auVar132._8_4_ * auVar185._8_4_;
    local_600._12_4_ = auVar311._12_4_ * fVar189 + auVar132._12_4_ * auVar185._12_4_;
    local_600._16_4_ = auVar311._16_4_ * fVar245 + auVar132._16_4_ * auVar185._16_4_;
    local_600._20_4_ = auVar311._20_4_ * fVar190 + auVar132._20_4_ * auVar185._20_4_;
    local_600._24_4_ = auVar311._24_4_ * fVar248 + auVar132._24_4_ * auVar185._24_4_;
    local_600._28_4_ = fStack_204 + fVar339;
    local_4e0._0_4_ = auVar316._0_4_ * fVar222 + auVar132._0_4_ * auVar210._0_4_;
    local_4e0._4_4_ = auVar316._4_4_ * fVar168 + auVar132._4_4_ * auVar210._4_4_;
    local_4e0._8_4_ = auVar316._8_4_ * fVar242 + auVar132._8_4_ * auVar210._8_4_;
    local_4e0._12_4_ = auVar316._12_4_ * fVar189 + auVar132._12_4_ * auVar210._12_4_;
    local_4e0._16_4_ = auVar316._16_4_ * fVar245 + auVar132._16_4_ * auVar210._16_4_;
    local_4e0._20_4_ = auVar316._20_4_ * fVar190 + auVar132._20_4_ * auVar210._20_4_;
    local_4e0._24_4_ = auVar316._24_4_ * fVar248 + auVar132._24_4_ * auVar210._24_4_;
    local_4e0._28_4_ = fVar339 + fStack_204;
    local_b00._0_4_ = auVar79._0_4_;
    local_680._0_4_ = fVar222 * auVar288._0_4_ + auVar132._0_4_ * auVar231._0_4_;
    local_680._4_4_ = fVar168 * auVar288._4_4_ + auVar132._4_4_ * auVar231._4_4_;
    local_680._8_4_ = fVar242 * auVar288._8_4_ + auVar132._8_4_ * auVar231._8_4_;
    local_680._12_4_ = fVar189 * auVar288._12_4_ + auVar132._12_4_ * auVar231._12_4_;
    local_680._16_4_ = fVar245 * auVar288._16_4_ + auVar132._16_4_ * auVar231._16_4_;
    local_680._20_4_ = fVar190 * auVar288._20_4_ + auVar132._20_4_ * auVar231._20_4_;
    local_680._24_4_ = fVar248 * auVar288._24_4_ + auVar132._24_4_ * auVar231._24_4_;
    local_680._28_4_ = auVar87._28_4_ + auVar132._28_4_;
    auVar87 = vsubps_avx(auVar264,auVar305);
    auVar329 = vsubps_avx(auVar185,auVar311);
    auVar88 = vsubps_avx(auVar210,auVar316);
    auVar298 = vsubps_avx(auVar231,auVar288);
    auVar86 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 0.04761905)),
                          ZEXT416((uint)((float)local_b00._0_4_ * 0.04761905)),0);
    fVar245 = auVar86._0_4_;
    fVar327 = fVar245 * auVar87._0_4_ * 3.0;
    fVar248 = auVar86._4_4_;
    fVar333 = fVar248 * auVar87._4_4_ * 3.0;
    local_860._4_4_ = fVar333;
    local_860._0_4_ = fVar327;
    fVar274 = auVar86._8_4_;
    fVar334 = fVar274 * auVar87._8_4_ * 3.0;
    fStack_858 = fVar334;
    fVar196 = auVar86._12_4_;
    fVar335 = fVar196 * auVar87._12_4_ * 3.0;
    fStack_854 = fVar335;
    fVar336 = fVar245 * auVar87._16_4_ * 3.0;
    unique0x100079ec = fVar336;
    fVar337 = fVar248 * auVar87._20_4_ * 3.0;
    unique0x100079f0 = fVar337;
    fVar338 = fVar274 * auVar87._24_4_ * 3.0;
    unique0x100079f4 = fVar338;
    unique0x100079f8 = fVar339;
    fVar315 = fVar245 * auVar329._0_4_ * 3.0;
    fVar319 = fVar248 * auVar329._4_4_ * 3.0;
    local_a20._4_4_ = fVar319;
    local_a20._0_4_ = fVar315;
    fVar320 = fVar274 * auVar329._8_4_ * 3.0;
    local_a20._8_4_ = fVar320;
    fVar321 = fVar196 * auVar329._12_4_ * 3.0;
    local_a20._12_4_ = fVar321;
    fVar322 = fVar245 * auVar329._16_4_ * 3.0;
    local_a20._16_4_ = fVar322;
    fVar323 = fVar248 * auVar329._20_4_ * 3.0;
    local_a20._20_4_ = fVar323;
    fVar324 = fVar274 * auVar329._24_4_ * 3.0;
    local_a20._24_4_ = fVar324;
    local_a20._28_4_ = auVar316._28_4_;
    fVar340 = fVar245 * auVar88._0_4_ * 3.0;
    fVar346 = fVar248 * auVar88._4_4_ * 3.0;
    local_a40._4_4_ = fVar346;
    local_a40._0_4_ = fVar340;
    fVar348 = fVar274 * auVar88._8_4_ * 3.0;
    local_a40._8_4_ = fVar348;
    fVar350 = fVar196 * auVar88._12_4_ * 3.0;
    local_a40._12_4_ = fVar350;
    fVar352 = fVar245 * auVar88._16_4_ * 3.0;
    local_a40._16_4_ = fVar352;
    fVar355 = fVar248 * auVar88._20_4_ * 3.0;
    local_a40._20_4_ = fVar355;
    fVar358 = fVar274 * auVar88._24_4_ * 3.0;
    local_a40._24_4_ = fVar358;
    local_a40._28_4_ = fVar361;
    fVar190 = fVar245 * auVar298._0_4_ * 3.0;
    fVar271 = fVar248 * auVar298._4_4_ * 3.0;
    auVar299._4_4_ = fVar271;
    auVar299._0_4_ = fVar190;
    fVar192 = fVar274 * auVar298._8_4_ * 3.0;
    auVar299._8_4_ = fVar192;
    fVar198 = fVar196 * auVar298._12_4_ * 3.0;
    auVar299._12_4_ = fVar198;
    fVar245 = fVar245 * auVar298._16_4_ * 3.0;
    auVar299._16_4_ = fVar245;
    fVar248 = fVar248 * auVar298._20_4_ * 3.0;
    auVar299._20_4_ = fVar248;
    fVar274 = fVar274 * auVar298._24_4_ * 3.0;
    auVar299._24_4_ = fVar274;
    auVar299._28_4_ = fVar196;
    auVar87 = vperm2f128_avx(local_600,local_600,1);
    auVar87 = vshufps_avx(auVar87,local_600,0x30);
    _local_940 = vshufps_avx(local_600,auVar87,0x29);
    auVar87 = vperm2f128_avx(local_4e0,local_4e0,1);
    auVar87 = vshufps_avx(auVar87,local_4e0,0x30);
    _local_840 = vshufps_avx(local_4e0,auVar87,0x29);
    auVar329 = vsubps_avx(local_680,auVar299);
    auVar87 = vperm2f128_avx(auVar329,auVar329,1);
    auVar87 = vshufps_avx(auVar87,auVar329,0x30);
    local_6a0 = vshufps_avx(auVar329,auVar87,0x29);
    local_520 = vsubps_avx(_local_940,local_600);
    local_500 = vsubps_avx(_local_840,local_4e0);
    fVar168 = local_520._0_4_;
    fVar191 = local_520._4_4_;
    auVar298._4_4_ = fVar346 * fVar191;
    auVar298._0_4_ = fVar340 * fVar168;
    fVar193 = local_520._8_4_;
    auVar298._8_4_ = fVar348 * fVar193;
    fVar217 = local_520._12_4_;
    auVar298._12_4_ = fVar350 * fVar217;
    fVar243 = local_520._16_4_;
    auVar298._16_4_ = fVar352 * fVar243;
    fVar259 = local_520._20_4_;
    auVar298._20_4_ = fVar355 * fVar259;
    fVar281 = local_520._24_4_;
    auVar298._24_4_ = fVar358 * fVar281;
    auVar298._28_4_ = auVar329._28_4_;
    fVar242 = local_500._0_4_;
    fVar258 = local_500._4_4_;
    auVar344._4_4_ = fVar319 * fVar258;
    auVar344._0_4_ = fVar315 * fVar242;
    fVar194 = local_500._8_4_;
    auVar344._8_4_ = fVar320 * fVar194;
    fVar218 = local_500._12_4_;
    auVar344._12_4_ = fVar321 * fVar218;
    fVar246 = local_500._16_4_;
    auVar344._16_4_ = fVar322 * fVar246;
    fVar270 = local_500._20_4_;
    auVar344._20_4_ = fVar323 * fVar270;
    fVar325 = local_500._24_4_;
    auVar344._24_4_ = fVar324 * fVar325;
    auVar344._28_4_ = auVar87._28_4_;
    auVar88 = vsubps_avx(auVar344,auVar298);
    auVar56._4_4_ = fVar98;
    auVar56._0_4_ = fVar71;
    auVar56._8_4_ = fVar102;
    auVar56._12_4_ = fVar105;
    auVar56._16_4_ = fVar108;
    auVar56._20_4_ = fVar111;
    auVar56._24_4_ = fVar114;
    auVar56._28_4_ = fVar117;
    auVar87 = vperm2f128_avx(auVar56,auVar56,1);
    auVar87 = vshufps_avx(auVar87,auVar56,0x30);
    local_7a0 = vshufps_avx(auVar56,auVar87,0x29);
    local_8a0 = vsubps_avx(local_7a0,auVar56);
    auVar13._4_4_ = fVar333 * fVar258;
    auVar13._0_4_ = fVar327 * fVar242;
    auVar13._8_4_ = fVar334 * fVar194;
    auVar13._12_4_ = fVar335 * fVar218;
    auVar13._16_4_ = fVar336 * fVar246;
    auVar13._20_4_ = fVar337 * fVar270;
    auVar13._24_4_ = fVar338 * fVar325;
    auVar13._28_4_ = auVar87._28_4_;
    fVar189 = local_8a0._0_4_;
    fVar269 = local_8a0._4_4_;
    auVar14._4_4_ = fVar346 * fVar269;
    auVar14._0_4_ = fVar340 * fVar189;
    fVar195 = local_8a0._8_4_;
    auVar14._8_4_ = fVar348 * fVar195;
    fVar219 = local_8a0._12_4_;
    auVar14._12_4_ = fVar350 * fVar219;
    fVar249 = local_8a0._16_4_;
    auVar14._16_4_ = fVar352 * fVar249;
    fVar272 = local_8a0._20_4_;
    auVar14._20_4_ = fVar355 * fVar272;
    fVar11 = local_8a0._24_4_;
    auVar14._24_4_ = fVar358 * fVar11;
    auVar14._28_4_ = local_840._28_4_;
    auVar298 = vsubps_avx(auVar14,auVar13);
    auVar15._4_4_ = fVar319 * fVar269;
    auVar15._0_4_ = fVar315 * fVar189;
    auVar15._8_4_ = fVar320 * fVar195;
    auVar15._12_4_ = fVar321 * fVar219;
    auVar15._16_4_ = fVar322 * fVar249;
    auVar15._20_4_ = fVar323 * fVar272;
    auVar15._24_4_ = fVar324 * fVar11;
    auVar15._28_4_ = local_840._28_4_;
    auVar313._4_4_ = fVar333 * fVar191;
    auVar313._0_4_ = fVar327 * fVar168;
    auVar313._8_4_ = fVar334 * fVar193;
    auVar313._12_4_ = fVar335 * fVar217;
    auVar313._16_4_ = fVar336 * fVar243;
    auVar313._20_4_ = fVar337 * fVar259;
    auVar313._24_4_ = fVar338 * fVar281;
    auVar313._28_4_ = auVar311._28_4_;
    auVar299 = vsubps_avx(auVar313,auVar15);
    fVar222 = auVar299._28_4_;
    auVar159._0_4_ = fVar189 * fVar189 + fVar168 * fVar168 + fVar242 * fVar242;
    auVar159._4_4_ = fVar269 * fVar269 + fVar191 * fVar191 + fVar258 * fVar258;
    auVar159._8_4_ = fVar195 * fVar195 + fVar193 * fVar193 + fVar194 * fVar194;
    auVar159._12_4_ = fVar219 * fVar219 + fVar217 * fVar217 + fVar218 * fVar218;
    auVar159._16_4_ = fVar249 * fVar249 + fVar243 * fVar243 + fVar246 * fVar246;
    auVar159._20_4_ = fVar272 * fVar272 + fVar259 * fVar259 + fVar270 * fVar270;
    auVar159._24_4_ = fVar11 * fVar11 + fVar281 * fVar281 + fVar325 * fVar325;
    auVar159._28_4_ = fVar222 + fVar222 + auVar88._28_4_;
    auVar87 = vrcpps_avx(auVar159);
    fVar216 = auVar87._0_4_;
    fVar220 = auVar87._4_4_;
    auVar16._4_4_ = fVar220 * auVar159._4_4_;
    auVar16._0_4_ = fVar216 * auVar159._0_4_;
    fVar221 = auVar87._8_4_;
    auVar16._8_4_ = fVar221 * auVar159._8_4_;
    fVar223 = auVar87._12_4_;
    auVar16._12_4_ = fVar223 * auVar159._12_4_;
    fVar251 = auVar87._16_4_;
    auVar16._16_4_ = fVar251 * auVar159._16_4_;
    fVar253 = auVar87._20_4_;
    auVar16._20_4_ = fVar253 * auVar159._20_4_;
    fVar255 = auVar87._24_4_;
    auVar16._24_4_ = fVar255 * auVar159._24_4_;
    auVar16._28_4_ = auVar311._28_4_;
    auVar89._8_4_ = 0x3f800000;
    auVar89._0_8_ = 0x3f8000003f800000;
    auVar89._12_4_ = 0x3f800000;
    auVar89._16_4_ = 0x3f800000;
    auVar89._20_4_ = 0x3f800000;
    auVar89._24_4_ = 0x3f800000;
    auVar89._28_4_ = 0x3f800000;
    auVar344 = vsubps_avx(auVar89,auVar16);
    fVar216 = auVar344._0_4_ * fVar216 + fVar216;
    fVar220 = auVar344._4_4_ * fVar220 + fVar220;
    fVar221 = auVar344._8_4_ * fVar221 + fVar221;
    fVar223 = auVar344._12_4_ * fVar223 + fVar223;
    fVar251 = auVar344._16_4_ * fVar251 + fVar251;
    fVar253 = auVar344._20_4_ * fVar253 + fVar253;
    fVar255 = auVar344._24_4_ * fVar255 + fVar255;
    auVar329 = vperm2f128_avx(local_a20,local_a20,1);
    auVar329 = vshufps_avx(auVar329,local_a20,0x30);
    local_a60 = vshufps_avx(local_a20,auVar329,0x29);
    auVar329 = vperm2f128_avx(local_a40,local_a40,1);
    auVar329 = vshufps_avx(auVar329,local_a40,0x30);
    local_7e0 = vshufps_avx(local_a40,auVar329,0x29);
    fVar72 = local_7e0._0_4_;
    fVar99 = local_7e0._4_4_;
    auVar17._4_4_ = fVar99 * fVar191;
    auVar17._0_4_ = fVar72 * fVar168;
    fVar103 = local_7e0._8_4_;
    auVar17._8_4_ = fVar103 * fVar193;
    fVar106 = local_7e0._12_4_;
    auVar17._12_4_ = fVar106 * fVar217;
    fVar109 = local_7e0._16_4_;
    auVar17._16_4_ = fVar109 * fVar243;
    fVar112 = local_7e0._20_4_;
    auVar17._20_4_ = fVar112 * fVar259;
    fVar115 = local_7e0._24_4_;
    auVar17._24_4_ = fVar115 * fVar281;
    auVar17._28_4_ = auVar329._28_4_;
    fVar119 = local_a60._0_4_;
    fVar141 = local_a60._4_4_;
    auVar18._4_4_ = fVar141 * fVar258;
    auVar18._0_4_ = fVar119 * fVar242;
    fVar143 = local_a60._8_4_;
    auVar18._8_4_ = fVar143 * fVar194;
    fVar146 = local_a60._12_4_;
    auVar18._12_4_ = fVar146 * fVar218;
    fVar147 = local_a60._16_4_;
    auVar18._16_4_ = fVar147 * fVar246;
    fVar148 = local_a60._20_4_;
    auVar18._20_4_ = fVar148 * fVar270;
    fVar149 = local_a60._24_4_;
    auVar18._24_4_ = fVar149 * fVar325;
    auVar18._28_4_ = auVar316._28_4_;
    auVar13 = vsubps_avx(auVar18,auVar17);
    auVar329 = vperm2f128_avx(_local_860,_local_860,1);
    auVar329 = vshufps_avx(auVar329,_local_860,0x30);
    local_7c0 = vshufps_avx(_local_860,auVar329,0x29);
    fVar341 = local_7c0._0_4_;
    fVar347 = local_7c0._4_4_;
    auVar19._4_4_ = fVar347 * fVar258;
    auVar19._0_4_ = fVar341 * fVar242;
    fVar349 = local_7c0._8_4_;
    auVar19._8_4_ = fVar349 * fVar194;
    fVar351 = local_7c0._12_4_;
    auVar19._12_4_ = fVar351 * fVar218;
    fVar353 = local_7c0._16_4_;
    auVar19._16_4_ = fVar353 * fVar246;
    fVar356 = local_7c0._20_4_;
    auVar19._20_4_ = fVar356 * fVar270;
    fVar359 = local_7c0._24_4_;
    auVar19._24_4_ = fVar359 * fVar325;
    auVar19._28_4_ = auVar329._28_4_;
    auVar15 = local_7e0;
    auVar20._4_4_ = fVar269 * fVar99;
    auVar20._0_4_ = fVar189 * fVar72;
    auVar20._8_4_ = fVar195 * fVar103;
    auVar20._12_4_ = fVar219 * fVar106;
    auVar20._16_4_ = fVar249 * fVar109;
    auVar20._20_4_ = fVar272 * fVar112;
    auVar20._24_4_ = fVar11 * fVar115;
    auVar20._28_4_ = fVar339;
    auVar329 = vsubps_avx(auVar20,auVar19);
    auVar21._4_4_ = fVar269 * fVar141;
    auVar21._0_4_ = fVar189 * fVar119;
    auVar21._8_4_ = fVar195 * fVar143;
    auVar21._12_4_ = fVar219 * fVar146;
    auVar21._16_4_ = fVar249 * fVar147;
    auVar21._20_4_ = fVar272 * fVar148;
    auVar21._24_4_ = fVar11 * fVar149;
    auVar21._28_4_ = fVar339;
    auVar22._4_4_ = fVar347 * fVar191;
    auVar22._0_4_ = fVar341 * fVar168;
    auVar22._8_4_ = fVar349 * fVar193;
    auVar22._12_4_ = fVar351 * fVar217;
    auVar22._16_4_ = fVar353 * fVar243;
    auVar22._20_4_ = fVar356 * fVar259;
    fVar257 = local_7c0._28_4_;
    auVar22._24_4_ = fVar359 * fVar281;
    auVar22._28_4_ = fVar257;
    auVar14 = vsubps_avx(auVar22,auVar21);
    fVar100 = auVar14._28_4_;
    fVar326 = auVar329._28_4_ + fVar100;
    auVar23._4_4_ =
         (auVar88._4_4_ * auVar88._4_4_ +
         auVar298._4_4_ * auVar298._4_4_ + auVar299._4_4_ * auVar299._4_4_) * fVar220;
    auVar23._0_4_ =
         (auVar88._0_4_ * auVar88._0_4_ +
         auVar298._0_4_ * auVar298._0_4_ + auVar299._0_4_ * auVar299._0_4_) * fVar216;
    auVar23._8_4_ =
         (auVar88._8_4_ * auVar88._8_4_ +
         auVar298._8_4_ * auVar298._8_4_ + auVar299._8_4_ * auVar299._8_4_) * fVar221;
    auVar23._12_4_ =
         (auVar88._12_4_ * auVar88._12_4_ +
         auVar298._12_4_ * auVar298._12_4_ + auVar299._12_4_ * auVar299._12_4_) * fVar223;
    auVar23._16_4_ =
         (auVar88._16_4_ * auVar88._16_4_ +
         auVar298._16_4_ * auVar298._16_4_ + auVar299._16_4_ * auVar299._16_4_) * fVar251;
    auVar23._20_4_ =
         (auVar88._20_4_ * auVar88._20_4_ +
         auVar298._20_4_ * auVar298._20_4_ + auVar299._20_4_ * auVar299._20_4_) * fVar253;
    auVar23._24_4_ =
         (auVar88._24_4_ * auVar88._24_4_ +
         auVar298._24_4_ * auVar298._24_4_ + auVar299._24_4_ * auVar299._24_4_) * fVar255;
    auVar23._28_4_ = auVar88._28_4_ + auVar298._28_4_ + fVar222;
    auVar24._4_4_ =
         (auVar13._4_4_ * auVar13._4_4_ +
         auVar329._4_4_ * auVar329._4_4_ + auVar14._4_4_ * auVar14._4_4_) * fVar220;
    auVar24._0_4_ =
         (auVar13._0_4_ * auVar13._0_4_ +
         auVar329._0_4_ * auVar329._0_4_ + auVar14._0_4_ * auVar14._0_4_) * fVar216;
    auVar24._8_4_ =
         (auVar13._8_4_ * auVar13._8_4_ +
         auVar329._8_4_ * auVar329._8_4_ + auVar14._8_4_ * auVar14._8_4_) * fVar221;
    auVar24._12_4_ =
         (auVar13._12_4_ * auVar13._12_4_ +
         auVar329._12_4_ * auVar329._12_4_ + auVar14._12_4_ * auVar14._12_4_) * fVar223;
    auVar24._16_4_ =
         (auVar13._16_4_ * auVar13._16_4_ +
         auVar329._16_4_ * auVar329._16_4_ + auVar14._16_4_ * auVar14._16_4_) * fVar251;
    auVar24._20_4_ =
         (auVar13._20_4_ * auVar13._20_4_ +
         auVar329._20_4_ * auVar329._20_4_ + auVar14._20_4_ * auVar14._20_4_) * fVar253;
    auVar24._24_4_ =
         (auVar13._24_4_ * auVar13._24_4_ +
         auVar329._24_4_ * auVar329._24_4_ + auVar14._24_4_ * auVar14._24_4_) * fVar255;
    auVar24._28_4_ = auVar344._28_4_ + auVar87._28_4_;
    auVar87 = vmaxps_avx(auVar23,auVar24);
    auVar329 = vperm2f128_avx(local_680,local_680,1);
    auVar329 = vshufps_avx(auVar329,local_680,0x30);
    _local_6c0 = vshufps_avx(local_680,auVar329,0x29);
    local_740._0_4_ = (float)local_680._0_4_ + fVar190;
    local_740._4_4_ = local_680._4_4_ + fVar271;
    local_740._8_4_ = local_680._8_4_ + fVar192;
    local_740._12_4_ = local_680._12_4_ + fVar198;
    local_740._16_4_ = local_680._16_4_ + fVar245;
    local_740._20_4_ = local_680._20_4_ + fVar248;
    local_740._24_4_ = local_680._24_4_ + fVar274;
    local_740._28_4_ = local_680._28_4_ + fVar196;
    auVar329 = vmaxps_avx(local_680,local_740);
    auVar88 = vmaxps_avx(local_6a0,_local_6c0);
    auVar329 = vmaxps_avx(auVar329,auVar88);
    auVar88 = vrsqrtps_avx(auVar159);
    fVar222 = auVar88._0_4_;
    fVar245 = auVar88._4_4_;
    fVar190 = auVar88._8_4_;
    fVar248 = auVar88._12_4_;
    fVar271 = auVar88._16_4_;
    fVar274 = auVar88._20_4_;
    fVar192 = auVar88._24_4_;
    local_3e0 = fVar222 * 1.5 + fVar222 * fVar222 * fVar222 * auVar159._0_4_ * -0.5;
    fStack_3dc = fVar245 * 1.5 + fVar245 * fVar245 * fVar245 * auVar159._4_4_ * -0.5;
    fStack_3d8 = fVar190 * 1.5 + fVar190 * fVar190 * fVar190 * auVar159._8_4_ * -0.5;
    fStack_3d4 = fVar248 * 1.5 + fVar248 * fVar248 * fVar248 * auVar159._12_4_ * -0.5;
    fStack_3d0 = fVar271 * 1.5 + fVar271 * fVar271 * fVar271 * auVar159._16_4_ * -0.5;
    fStack_3cc = fVar274 * 1.5 + fVar274 * fVar274 * fVar274 * auVar159._20_4_ * -0.5;
    fStack_3c8 = fVar192 * 1.5 + fVar192 * fVar192 * fVar192 * auVar159._24_4_ * -0.5;
    auVar298 = ZEXT1232(ZEXT412(0)) << 0x20;
    _local_880 = vsubps_avx(auVar298,local_600);
    fVar197 = local_880._28_4_;
    _local_820 = vsubps_avx(auVar298,local_4e0);
    fVar245 = local_820._0_4_;
    fVar271 = local_820._4_4_;
    fVar196 = local_820._8_4_;
    fVar220 = local_820._12_4_;
    fVar251 = local_820._16_4_;
    fVar275 = local_820._20_4_;
    fVar354 = local_820._24_4_;
    fVar190 = local_880._0_4_;
    fVar274 = local_880._4_4_;
    fVar198 = local_880._8_4_;
    fVar221 = local_880._12_4_;
    fVar253 = local_880._16_4_;
    fVar277 = local_880._20_4_;
    fVar357 = local_880._24_4_;
    auVar57._4_4_ = fVar98;
    auVar57._0_4_ = fVar71;
    auVar57._8_4_ = fVar102;
    auVar57._12_4_ = fVar105;
    auVar57._16_4_ = fVar108;
    auVar57._20_4_ = fVar111;
    auVar57._24_4_ = fVar114;
    auVar57._28_4_ = fVar117;
    auVar299 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar298 = vsubps_avx(auVar299,auVar57);
    fVar248 = auVar298._0_4_;
    fVar192 = auVar298._4_4_;
    fVar216 = auVar298._8_4_;
    fVar223 = auVar298._12_4_;
    fVar255 = auVar298._16_4_;
    fVar279 = auVar298._20_4_;
    fVar360 = auVar298._24_4_;
    auVar312._0_4_ = local_6e0 * fVar248 + local_700 * fVar190 + local_720 * fVar245;
    auVar312._4_4_ = fStack_6dc * fVar192 + fStack_6fc * fVar274 + fStack_71c * fVar271;
    auVar312._8_4_ = fStack_6d8 * fVar216 + fStack_6f8 * fVar198 + fStack_718 * fVar196;
    auVar312._12_4_ = fStack_6d4 * fVar223 + fStack_6f4 * fVar221 + fStack_714 * fVar220;
    auVar312._16_4_ = fStack_6d0 * fVar255 + fStack_6f0 * fVar253 + fStack_710 * fVar251;
    auVar312._20_4_ = fStack_6cc * fVar279 + fStack_6ec * fVar277 + fStack_70c * fVar275;
    auVar312._24_4_ = fStack_6c8 * fVar360 + fStack_6e8 * fVar357 + fStack_708 * fVar354;
    auVar312._28_4_ = fVar100 + fVar326 + auVar13._28_4_ + fVar326;
    auVar330._0_4_ = fVar248 * fVar248 + fVar190 * fVar190 + fVar245 * fVar245;
    auVar330._4_4_ = fVar192 * fVar192 + fVar274 * fVar274 + fVar271 * fVar271;
    auVar330._8_4_ = fVar216 * fVar216 + fVar198 * fVar198 + fVar196 * fVar196;
    auVar330._12_4_ = fVar223 * fVar223 + fVar221 * fVar221 + fVar220 * fVar220;
    auVar330._16_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar251 * fVar251;
    auVar330._20_4_ = fVar279 * fVar279 + fVar277 * fVar277 + fVar275 * fVar275;
    auVar330._24_4_ = fVar360 * fVar360 + fVar357 * fVar357 + fVar354 * fVar354;
    auVar330._28_4_ = fVar257 + fVar257 + fVar100;
    fVar222 = local_500._28_4_;
    local_5e0._0_4_ =
         local_6e0 * fVar189 * local_3e0 +
         fVar168 * local_3e0 * local_700 + fVar242 * local_3e0 * local_720;
    local_5e0._4_4_ =
         fStack_6dc * fVar269 * fStack_3dc +
         fVar191 * fStack_3dc * fStack_6fc + fVar258 * fStack_3dc * fStack_71c;
    fStack_5d8 = fStack_6d8 * fVar195 * fStack_3d8 +
                 fVar193 * fStack_3d8 * fStack_6f8 + fVar194 * fStack_3d8 * fStack_718;
    fStack_5d4 = fStack_6d4 * fVar219 * fStack_3d4 +
                 fVar217 * fStack_3d4 * fStack_6f4 + fVar218 * fStack_3d4 * fStack_714;
    fStack_5d0 = fStack_6d0 * fVar249 * fStack_3d0 +
                 fVar243 * fStack_3d0 * fStack_6f0 + fVar246 * fStack_3d0 * fStack_710;
    fStack_5cc = fStack_6cc * fVar272 * fStack_3cc +
                 fVar259 * fStack_3cc * fStack_6ec + fVar270 * fStack_3cc * fStack_70c;
    fStack_5c8 = fStack_6c8 * fVar11 * fStack_3c8 +
                 fVar281 * fStack_3c8 * fStack_6e8 + fVar325 * fStack_3c8 * fStack_708;
    fVar257 = local_520._28_4_ + fVar222 + fStack_704;
    auVar289._0_4_ =
         fVar248 * fVar189 * local_3e0 +
         fVar168 * local_3e0 * fVar190 + fVar242 * local_3e0 * fVar245;
    auVar289._4_4_ =
         fVar192 * fVar269 * fStack_3dc +
         fVar191 * fStack_3dc * fVar274 + fVar258 * fStack_3dc * fVar271;
    auVar289._8_4_ =
         fVar216 * fVar195 * fStack_3d8 +
         fVar193 * fStack_3d8 * fVar198 + fVar194 * fStack_3d8 * fVar196;
    auVar289._12_4_ =
         fVar223 * fVar219 * fStack_3d4 +
         fVar217 * fStack_3d4 * fVar221 + fVar218 * fStack_3d4 * fVar220;
    auVar289._16_4_ =
         fVar255 * fVar249 * fStack_3d0 +
         fVar243 * fStack_3d0 * fVar253 + fVar246 * fStack_3d0 * fVar251;
    auVar289._20_4_ =
         fVar279 * fVar272 * fStack_3cc +
         fVar259 * fStack_3cc * fVar277 + fVar270 * fStack_3cc * fVar275;
    auVar289._24_4_ =
         fVar360 * fVar11 * fStack_3c8 +
         fVar281 * fStack_3c8 * fVar357 + fVar325 * fStack_3c8 * fVar354;
    auVar289._28_4_ = fVar222 + fVar257;
    auVar25._4_4_ = (float)local_5e0._4_4_ * auVar289._4_4_;
    auVar25._0_4_ = (float)local_5e0._0_4_ * auVar289._0_4_;
    auVar25._8_4_ = fStack_5d8 * auVar289._8_4_;
    auVar25._12_4_ = fStack_5d4 * auVar289._12_4_;
    auVar25._16_4_ = fStack_5d0 * auVar289._16_4_;
    auVar25._20_4_ = fStack_5cc * auVar289._20_4_;
    auVar25._24_4_ = fStack_5c8 * auVar289._24_4_;
    auVar25._28_4_ = fVar257;
    auVar298 = vsubps_avx(auVar312,auVar25);
    auVar26._4_4_ = auVar289._4_4_ * auVar289._4_4_;
    auVar26._0_4_ = auVar289._0_4_ * auVar289._0_4_;
    auVar26._8_4_ = auVar289._8_4_ * auVar289._8_4_;
    auVar26._12_4_ = auVar289._12_4_ * auVar289._12_4_;
    auVar26._16_4_ = auVar289._16_4_ * auVar289._16_4_;
    auVar26._20_4_ = auVar289._20_4_ * auVar289._20_4_;
    auVar26._24_4_ = auVar289._24_4_ * auVar289._24_4_;
    auVar26._28_4_ = fVar222;
    _local_760 = vsubps_avx(auVar330,auVar26);
    auVar268 = ZEXT3264(_local_760);
    _local_5c0 = vsqrtps_avx(auVar87);
    fVar257 = (local_5c0._0_4_ + auVar329._0_4_) * 1.0000002;
    fVar100 = (local_5c0._4_4_ + auVar329._4_4_) * 1.0000002;
    fVar326 = (local_5c0._8_4_ + auVar329._8_4_) * 1.0000002;
    fVar107 = (local_5c0._12_4_ + auVar329._12_4_) * 1.0000002;
    fVar110 = (local_5c0._16_4_ + auVar329._16_4_) * 1.0000002;
    fVar113 = (local_5c0._20_4_ + auVar329._20_4_) * 1.0000002;
    fVar116 = (local_5c0._24_4_ + auVar329._24_4_) * 1.0000002;
    auVar27._4_4_ = fVar100 * fVar100;
    auVar27._0_4_ = fVar257 * fVar257;
    auVar27._8_4_ = fVar326 * fVar326;
    auVar27._12_4_ = fVar107 * fVar107;
    auVar27._16_4_ = fVar110 * fVar110;
    auVar27._20_4_ = fVar113 * fVar113;
    auVar27._24_4_ = fVar116 * fVar116;
    auVar27._28_4_ = local_5c0._28_4_ + auVar329._28_4_;
    fVar257 = auVar298._0_4_ + auVar298._0_4_;
    fVar100 = auVar298._4_4_ + auVar298._4_4_;
    local_340._0_8_ = CONCAT44(fVar100,fVar257);
    local_340._8_4_ = auVar298._8_4_ + auVar298._8_4_;
    local_340._12_4_ = auVar298._12_4_ + auVar298._12_4_;
    local_340._16_4_ = auVar298._16_4_ + auVar298._16_4_;
    local_340._20_4_ = auVar298._20_4_ + auVar298._20_4_;
    local_340._24_4_ = auVar298._24_4_ + auVar298._24_4_;
    local_340._28_4_ = auVar298._28_4_ + auVar298._28_4_;
    auVar329 = vsubps_avx(_local_760,auVar27);
    local_320._4_4_ = (float)local_5e0._4_4_ * (float)local_5e0._4_4_;
    local_320._0_4_ = (float)local_5e0._0_4_ * (float)local_5e0._0_4_;
    local_320._8_4_ = fStack_5d8 * fStack_5d8;
    local_320._12_4_ = fStack_5d4 * fStack_5d4;
    local_320._16_4_ = fStack_5d0 * fStack_5d0;
    local_320._20_4_ = fStack_5cc * fStack_5cc;
    local_320._24_4_ = fStack_5c8 * fStack_5c8;
    local_320._28_4_ = fStack_6c4;
    local_400 = vsubps_avx(local_200,local_320);
    local_580._4_4_ = fVar100 * fVar100;
    local_580._0_4_ = fVar257 * fVar257;
    fStack_578 = local_340._8_4_ * local_340._8_4_;
    fStack_574 = local_340._12_4_ * local_340._12_4_;
    fStack_570 = local_340._16_4_ * local_340._16_4_;
    fStack_56c = local_340._20_4_ * local_340._20_4_;
    fStack_568 = local_340._24_4_ * local_340._24_4_;
    unique0x1000dfc0 = 0x3f800002;
    fVar326 = local_400._0_4_;
    local_5a0._0_4_ = fVar326 * 4.0;
    fVar107 = local_400._4_4_;
    local_5a0._4_4_ = fVar107 * 4.0;
    fVar110 = local_400._8_4_;
    fStack_598 = fVar110 * 4.0;
    fVar113 = local_400._12_4_;
    fStack_594 = fVar113 * 4.0;
    fVar116 = local_400._16_4_;
    fStack_590 = fVar116 * 4.0;
    fVar308 = local_400._20_4_;
    fStack_58c = fVar308 * 4.0;
    fVar309 = local_400._24_4_;
    fStack_588 = fVar309 * 4.0;
    uStack_584 = 0x40800000;
    auVar28._4_4_ = auVar329._4_4_ * (float)local_5a0._4_4_;
    auVar28._0_4_ = auVar329._0_4_ * (float)local_5a0._0_4_;
    auVar28._8_4_ = auVar329._8_4_ * fStack_598;
    auVar28._12_4_ = auVar329._12_4_ * fStack_594;
    auVar28._16_4_ = auVar329._16_4_ * fStack_590;
    auVar28._20_4_ = auVar329._20_4_ * fStack_58c;
    auVar28._24_4_ = auVar329._24_4_ * fStack_588;
    auVar28._28_4_ = 0x40800000;
    auVar298 = vsubps_avx(_local_580,auVar28);
    auVar87 = vcmpps_avx(auVar298,auVar299,5);
    fStack_5c4 = local_520._28_4_ + fVar222 + fStack_704;
    fVar222 = local_400._28_4_;
    if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar87 >> 0x7f,0) == '\0') &&
          (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar87 >> 0xbf,0) == '\0') &&
        (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar87[0x1f]) {
      auVar343._8_4_ = 0x7f800000;
      auVar343._0_8_ = 0x7f8000007f800000;
      auVar343._12_4_ = 0x7f800000;
      auVar343._16_4_ = 0x7f800000;
      auVar343._20_4_ = 0x7f800000;
      auVar343._24_4_ = 0x7f800000;
      auVar343._28_4_ = 0x7f800000;
      auVar211._8_4_ = 0xff800000;
      auVar211._0_8_ = 0xff800000ff800000;
      auVar211._12_4_ = 0xff800000;
      auVar211._16_4_ = 0xff800000;
      auVar211._20_4_ = 0xff800000;
      auVar211._24_4_ = 0xff800000;
      auVar211._28_4_ = 0xff800000;
      auVar310._4_4_ = fStack_6fc;
      auVar310._0_4_ = local_700;
      auVar310._8_4_ = fStack_6f8;
      auVar310._12_4_ = fStack_6f4;
      auVar310._16_4_ = fStack_6f0;
      auVar310._20_4_ = fStack_6ec;
      auVar310._24_4_ = fStack_6e8;
      auVar362._4_4_ = fStack_71c;
      auVar362._0_4_ = local_720;
      auVar362._8_4_ = fStack_718;
      auVar362._12_4_ = fStack_714;
      auVar362._16_4_ = fStack_710;
      auVar362._20_4_ = fStack_70c;
      auVar362._24_4_ = fStack_708;
    }
    else {
      auVar299 = vcmpps_avx(auVar298,auVar299,5);
      auVar344 = vsqrtps_avx(auVar298);
      auVar232._0_4_ = fVar326 + fVar326;
      auVar232._4_4_ = fVar107 + fVar107;
      auVar232._8_4_ = fVar110 + fVar110;
      auVar232._12_4_ = fVar113 + fVar113;
      auVar232._16_4_ = fVar116 + fVar116;
      auVar232._20_4_ = fVar308 + fVar308;
      auVar232._24_4_ = fVar309 + fVar309;
      auVar232._28_4_ = fVar222 + fVar222;
      auVar298 = vrcpps_avx(auVar232);
      fVar224 = auVar298._0_4_;
      fVar244 = auVar298._4_4_;
      auVar29._4_4_ = auVar232._4_4_ * fVar244;
      auVar29._0_4_ = auVar232._0_4_ * fVar224;
      fVar247 = auVar298._8_4_;
      auVar29._8_4_ = auVar232._8_4_ * fVar247;
      fVar250 = auVar298._12_4_;
      auVar29._12_4_ = auVar232._12_4_ * fVar250;
      fVar252 = auVar298._16_4_;
      auVar29._16_4_ = auVar232._16_4_ * fVar252;
      fVar254 = auVar298._20_4_;
      auVar29._20_4_ = auVar232._20_4_ * fVar254;
      fVar256 = auVar298._24_4_;
      auVar29._24_4_ = auVar232._24_4_ * fVar256;
      auVar29._28_4_ = auVar232._28_4_;
      auVar290._8_4_ = 0x3f800000;
      auVar290._0_8_ = 0x3f8000003f800000;
      auVar290._12_4_ = 0x3f800000;
      auVar290._16_4_ = 0x3f800000;
      auVar290._20_4_ = 0x3f800000;
      auVar290._24_4_ = 0x3f800000;
      auVar290._28_4_ = 0x3f800000;
      auVar13 = vsubps_avx(auVar290,auVar29);
      fVar224 = fVar224 + fVar224 * auVar13._0_4_;
      fVar244 = fVar244 + fVar244 * auVar13._4_4_;
      fVar247 = fVar247 + fVar247 * auVar13._8_4_;
      fVar250 = fVar250 + fVar250 * auVar13._12_4_;
      fVar252 = fVar252 + fVar252 * auVar13._16_4_;
      fVar254 = fVar254 + fVar254 * auVar13._20_4_;
      fVar256 = fVar256 + fVar256 * auVar13._24_4_;
      auVar265._0_8_ = CONCAT44(fVar100,fVar257) ^ 0x8000000080000000;
      auVar265._8_4_ = -local_340._8_4_;
      auVar265._12_4_ = -local_340._12_4_;
      auVar265._16_4_ = -local_340._16_4_;
      auVar265._20_4_ = -local_340._20_4_;
      auVar265._24_4_ = -local_340._24_4_;
      auVar265._28_4_ = -local_340._28_4_;
      auVar14 = vsubps_avx(auVar265,auVar344);
      fVar257 = auVar14._0_4_ * fVar224;
      fVar100 = auVar14._4_4_ * fVar244;
      auVar30._4_4_ = fVar100;
      auVar30._0_4_ = fVar257;
      fVar273 = auVar14._8_4_ * fVar247;
      auVar30._8_4_ = fVar273;
      fVar276 = auVar14._12_4_ * fVar250;
      auVar30._12_4_ = fVar276;
      fVar278 = auVar14._16_4_ * fVar252;
      auVar30._16_4_ = fVar278;
      fVar280 = auVar14._20_4_ * fVar254;
      auVar30._20_4_ = fVar280;
      fVar282 = auVar14._24_4_ * fVar256;
      auVar30._24_4_ = fVar282;
      auVar30._28_4_ = auVar14._28_4_;
      auVar268 = ZEXT3264(auVar30);
      auVar344 = vsubps_avx(auVar344,local_340);
      fVar224 = auVar344._0_4_ * fVar224;
      fVar244 = auVar344._4_4_ * fVar244;
      auVar31._4_4_ = fVar244;
      auVar31._0_4_ = fVar224;
      fVar247 = auVar344._8_4_ * fVar247;
      auVar31._8_4_ = fVar247;
      fVar250 = auVar344._12_4_ * fVar250;
      auVar31._12_4_ = fVar250;
      fVar252 = auVar344._16_4_ * fVar252;
      auVar31._16_4_ = fVar252;
      fVar254 = auVar344._20_4_ * fVar254;
      auVar31._20_4_ = fVar254;
      fVar256 = auVar344._24_4_ * fVar256;
      auVar31._24_4_ = fVar256;
      auVar31._28_4_ = auVar344._28_4_;
      local_540._4_4_ = fStack_3dc * (auVar289._4_4_ + (float)local_5e0._4_4_ * fVar100);
      local_540._0_4_ = local_3e0 * (auVar289._0_4_ + (float)local_5e0._0_4_ * fVar257);
      fStack_538 = fStack_3d8 * (auVar289._8_4_ + fStack_5d8 * fVar273);
      fStack_534 = fStack_3d4 * (auVar289._12_4_ + fStack_5d4 * fVar276);
      fStack_530 = fStack_3d0 * (auVar289._16_4_ + fStack_5d0 * fVar278);
      fStack_52c = fStack_3cc * (auVar289._20_4_ + fStack_5cc * fVar280);
      fStack_528 = fStack_3c8 * (auVar289._24_4_ + fStack_5c8 * fVar282);
      fStack_524 = auVar289._28_4_ + auVar298._28_4_ + auVar13._28_4_;
      auVar291._8_4_ = 0x7fffffff;
      auVar291._0_8_ = 0x7fffffff7fffffff;
      auVar291._12_4_ = 0x7fffffff;
      auVar291._16_4_ = 0x7fffffff;
      auVar291._20_4_ = 0x7fffffff;
      auVar291._24_4_ = 0x7fffffff;
      auVar291._28_4_ = 0x7fffffff;
      auVar298 = vandps_avx(local_320,auVar291);
      auVar298 = vmaxps_avx(local_3a0,auVar298);
      auVar32._4_4_ = auVar298._4_4_ * 1.9073486e-06;
      auVar32._0_4_ = auVar298._0_4_ * 1.9073486e-06;
      auVar32._8_4_ = auVar298._8_4_ * 1.9073486e-06;
      auVar32._12_4_ = auVar298._12_4_ * 1.9073486e-06;
      auVar32._16_4_ = auVar298._16_4_ * 1.9073486e-06;
      auVar32._20_4_ = auVar298._20_4_ * 1.9073486e-06;
      auVar32._24_4_ = auVar298._24_4_ * 1.9073486e-06;
      auVar32._28_4_ = auVar298._28_4_;
      auVar298 = vandps_avx(local_400,auVar291);
      auVar298 = vcmpps_avx(auVar298,auVar32,1);
      auVar292._8_4_ = 0x7f800000;
      auVar292._0_8_ = 0x7f8000007f800000;
      auVar292._12_4_ = 0x7f800000;
      auVar292._16_4_ = 0x7f800000;
      auVar292._20_4_ = 0x7f800000;
      auVar292._24_4_ = 0x7f800000;
      auVar292._28_4_ = 0x7f800000;
      auVar343 = vblendvps_avx(auVar292,auVar30,auVar299);
      local_560 = local_3e0 * (auVar289._0_4_ + (float)local_5e0._0_4_ * fVar224);
      fStack_55c = fStack_3dc * (auVar289._4_4_ + (float)local_5e0._4_4_ * fVar244);
      fStack_558 = fStack_3d8 * (auVar289._8_4_ + fStack_5d8 * fVar247);
      fStack_554 = fStack_3d4 * (auVar289._12_4_ + fStack_5d4 * fVar250);
      fStack_550 = fStack_3d0 * (auVar289._16_4_ + fStack_5d0 * fVar252);
      fStack_54c = fStack_3cc * (auVar289._20_4_ + fStack_5cc * fVar254);
      fStack_548 = fStack_3c8 * (auVar289._24_4_ + fStack_5c8 * fVar256);
      fStack_544 = auVar289._28_4_;
      auVar233._8_4_ = 0xff800000;
      auVar233._0_8_ = 0xff800000ff800000;
      auVar233._12_4_ = 0xff800000;
      auVar233._16_4_ = 0xff800000;
      auVar233._20_4_ = 0xff800000;
      auVar233._24_4_ = 0xff800000;
      auVar233._28_4_ = 0xff800000;
      auVar211 = vblendvps_avx(auVar233,auVar31,auVar299);
      auVar344 = auVar299 & auVar298;
      if ((((((((auVar344 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar344 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar344 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar344 >> 0x7f,0) == '\0') &&
            (auVar344 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar344 >> 0xbf,0) == '\0') &&
          (auVar344 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar344[0x1f]) {
        auVar310._4_4_ = fStack_6fc;
        auVar310._0_4_ = local_700;
        auVar310._8_4_ = fStack_6f8;
        auVar310._12_4_ = fStack_6f4;
        auVar310._16_4_ = fStack_6f0;
        auVar310._20_4_ = fStack_6ec;
        auVar310._24_4_ = fStack_6e8;
        auVar362._4_4_ = fStack_71c;
        auVar362._0_4_ = local_720;
        auVar362._8_4_ = fStack_718;
        auVar362._12_4_ = fStack_714;
        auVar362._16_4_ = fStack_710;
        auVar362._20_4_ = fStack_70c;
        auVar362._24_4_ = fStack_708;
      }
      else {
        auVar87 = vandps_avx(auVar298,auVar299);
        auVar86 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
        fVar197 = 0.0;
        auVar298 = vcmpps_avx(auVar329,ZEXT832(0) << 0x20,2);
        auVar268 = ZEXT3264(auVar298);
        auVar332._8_4_ = 0xff800000;
        auVar332._0_8_ = 0xff800000ff800000;
        auVar332._12_4_ = 0xff800000;
        auVar332._16_4_ = 0xff800000;
        auVar332._20_4_ = 0xff800000;
        auVar332._24_4_ = 0xff800000;
        auVar332._28_4_ = 0xff800000;
        auVar301._8_4_ = 0x7f800000;
        auVar301._0_8_ = 0x7f8000007f800000;
        auVar301._12_4_ = 0x7f800000;
        auVar301._16_4_ = 0x7f800000;
        auVar301._20_4_ = 0x7f800000;
        auVar301._24_4_ = 0x7f800000;
        auVar301._28_4_ = 0x7f800000;
        auVar329 = vblendvps_avx(auVar301,auVar332,auVar298);
        auVar12 = vpmovsxwd_avx(auVar86);
        auVar86 = vpunpckhwd_avx(auVar86,auVar86);
        auVar241._16_16_ = auVar86;
        auVar241._0_16_ = auVar12;
        auVar343 = vblendvps_avx(auVar343,auVar329,auVar241);
        auVar329 = vblendvps_avx(auVar332,auVar301,auVar298);
        auVar211 = vblendvps_avx(auVar211,auVar329,auVar241);
        auVar329 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar95._0_4_ = auVar87._0_4_ ^ auVar329._0_4_;
        auVar95._4_4_ = auVar87._4_4_ ^ auVar329._4_4_;
        auVar95._8_4_ = auVar87._8_4_ ^ auVar329._8_4_;
        auVar95._12_4_ = auVar87._12_4_ ^ auVar329._12_4_;
        auVar95._16_4_ = auVar87._16_4_ ^ auVar329._16_4_;
        auVar95._20_4_ = auVar87._20_4_ ^ auVar329._20_4_;
        auVar95._24_4_ = auVar87._24_4_ ^ auVar329._24_4_;
        auVar95._28_4_ = auVar87._28_4_ ^ auVar329._28_4_;
        auVar87 = vorps_avx(auVar298,auVar95);
        auVar87 = vandps_avx(auVar299,auVar87);
        auVar310._4_4_ = fStack_6fc;
        auVar310._0_4_ = local_700;
        auVar310._8_4_ = fStack_6f8;
        auVar310._12_4_ = fStack_6f4;
        auVar310._16_4_ = fStack_6f0;
        auVar310._20_4_ = fStack_6ec;
        auVar310._24_4_ = fStack_6e8;
        auVar362._4_4_ = fStack_71c;
        auVar362._0_4_ = local_720;
        auVar362._8_4_ = fStack_718;
        auVar362._12_4_ = fStack_714;
        auVar362._16_4_ = fStack_710;
        auVar362._20_4_ = fStack_70c;
        auVar362._24_4_ = fStack_708;
      }
    }
    auVar329 = local_360 & auVar87;
    auVar293 = auVar289;
    local_8a0._0_8_ = uVar62;
    if ((((((((auVar329 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar329 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar329 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar329 >> 0x7f,0) == '\0') &&
          (auVar329 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar329 >> 0xbf,0) == '\0') &&
        (auVar329 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar329[0x1f])
    {
LAB_00e422c7:
      auVar296 = ZEXT3264(auVar293);
LAB_00e422f4:
      auVar367 = ZEXT3264(local_9c0);
      auVar365 = ZEXT3264(local_900);
      auVar345 = ZEXT3264(local_9a0);
      auVar318 = ZEXT3264(local_a00);
      auVar314 = ZEXT3264(local_9e0);
      auVar307 = ZEXT3264(local_920);
    }
    else {
      fStack_3c4 = auVar88._28_4_ + auVar159._28_4_;
      auVar86 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_770._0_4_));
      auVar86 = vshufps_avx(auVar86,auVar86,0);
      auVar234._16_16_ = auVar86;
      auVar234._0_16_ = auVar86;
      auVar298 = vmaxps_avx(auVar234,auVar343);
      auVar86 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_770._0_4_));
      auVar86 = vshufps_avx(auVar86,auVar86,0);
      auVar235._16_16_ = auVar86;
      auVar235._0_16_ = auVar86;
      auVar299 = vminps_avx(auVar235,auVar211);
      auVar133._0_4_ = local_6e0 * fVar327 + auVar310._0_4_ * fVar315 + auVar362._0_4_ * fVar340;
      auVar133._4_4_ = fStack_6dc * fVar333 + auVar310._4_4_ * fVar319 + auVar362._4_4_ * fVar346;
      auVar133._8_4_ = fStack_6d8 * fVar334 + auVar310._8_4_ * fVar320 + auVar362._8_4_ * fVar348;
      auVar133._12_4_ = fStack_6d4 * fVar335 + auVar310._12_4_ * fVar321 + auVar362._12_4_ * fVar350
      ;
      auVar133._16_4_ = fStack_6d0 * fVar336 + auVar310._16_4_ * fVar322 + auVar362._16_4_ * fVar352
      ;
      auVar133._20_4_ = fStack_6cc * fVar337 + auVar310._20_4_ * fVar323 + auVar362._20_4_ * fVar355
      ;
      auVar133._24_4_ = fStack_6c8 * fVar338 + auVar310._24_4_ * fVar324 + auVar362._24_4_ * fVar358
      ;
      auVar133._28_4_ = fVar197 + fVar361 + fVar197;
      auVar329 = vrcpps_avx(auVar133);
      fVar257 = auVar329._0_4_;
      fVar100 = auVar329._4_4_;
      auVar33._4_4_ = auVar133._4_4_ * fVar100;
      auVar33._0_4_ = auVar133._0_4_ * fVar257;
      fVar361 = auVar329._8_4_;
      auVar33._8_4_ = auVar133._8_4_ * fVar361;
      fVar224 = auVar329._12_4_;
      auVar33._12_4_ = auVar133._12_4_ * fVar224;
      fVar244 = auVar329._16_4_;
      auVar33._16_4_ = auVar133._16_4_ * fVar244;
      fVar247 = auVar329._20_4_;
      auVar33._20_4_ = auVar133._20_4_ * fVar247;
      fVar250 = auVar329._24_4_;
      auVar33._24_4_ = auVar133._24_4_ * fVar250;
      auVar33._28_4_ = fVar339;
      auVar306._8_4_ = 0x3f800000;
      auVar306._0_8_ = 0x3f8000003f800000;
      auVar306._12_4_ = 0x3f800000;
      auVar306._16_4_ = 0x3f800000;
      auVar306._20_4_ = 0x3f800000;
      auVar306._24_4_ = 0x3f800000;
      auVar306._28_4_ = 0x3f800000;
      auVar88 = vsubps_avx(auVar306,auVar33);
      auVar293._8_4_ = 0x7fffffff;
      auVar293._0_8_ = 0x7fffffff7fffffff;
      auVar293._12_4_ = 0x7fffffff;
      auVar293._16_4_ = 0x7fffffff;
      auVar293._20_4_ = 0x7fffffff;
      auVar293._24_4_ = 0x7fffffff;
      auVar293._28_4_ = 0x7fffffff;
      auVar329 = vandps_avx(auVar133,auVar293);
      auVar363._8_4_ = 0x219392ef;
      auVar363._0_8_ = 0x219392ef219392ef;
      auVar363._12_4_ = 0x219392ef;
      auVar363._16_4_ = 0x219392ef;
      auVar363._20_4_ = 0x219392ef;
      auVar363._24_4_ = 0x219392ef;
      auVar363._28_4_ = 0x219392ef;
      auVar329 = vcmpps_avx(auVar329,auVar363,1);
      auVar34._4_4_ =
           (fVar100 + fVar100 * auVar88._4_4_) *
           -(fVar192 * fVar333 + fVar319 * fVar274 + fVar346 * fVar271);
      auVar34._0_4_ =
           (fVar257 + fVar257 * auVar88._0_4_) *
           -(fVar248 * fVar327 + fVar315 * fVar190 + fVar340 * fVar245);
      auVar34._8_4_ =
           (fVar361 + fVar361 * auVar88._8_4_) *
           -(fVar216 * fVar334 + fVar320 * fVar198 + fVar348 * fVar196);
      auVar34._12_4_ =
           (fVar224 + fVar224 * auVar88._12_4_) *
           -(fVar223 * fVar335 + fVar321 * fVar221 + fVar350 * fVar220);
      auVar34._16_4_ =
           (fVar244 + fVar244 * auVar88._16_4_) *
           -(fVar255 * fVar336 + fVar322 * fVar253 + fVar352 * fVar251);
      auVar34._20_4_ =
           (fVar247 + fVar247 * auVar88._20_4_) *
           -(fVar279 * fVar337 + fVar323 * fVar277 + fVar355 * fVar275);
      auVar34._24_4_ =
           (fVar250 + fVar250 * auVar88._24_4_) *
           -(fVar360 * fVar338 + fVar324 * fVar357 + fVar358 * fVar354);
      auVar34._28_4_ = -(fVar197 + local_340._28_4_ + fVar197);
      auVar86 = ZEXT816(0) << 0x40;
      auVar88 = vcmpps_avx(auVar133,ZEXT1632(auVar86),1);
      auVar344 = vorps_avx(auVar329,auVar88);
      auVar88 = vcmpps_avx(auVar133,ZEXT1632(auVar86),6);
      auVar88 = vorps_avx(auVar329,auVar88);
      auVar300._8_4_ = 0xff800000;
      auVar300._0_8_ = 0xff800000ff800000;
      auVar300._12_4_ = 0xff800000;
      auVar300._16_4_ = 0xff800000;
      auVar300._20_4_ = 0xff800000;
      auVar300._24_4_ = 0xff800000;
      auVar300._28_4_ = 0xff800000;
      auVar329 = vblendvps_avx(auVar34,auVar300,auVar344);
      auVar317._8_4_ = 0x7f800000;
      auVar317._0_8_ = 0x7f8000007f800000;
      auVar317._12_4_ = 0x7f800000;
      auVar317._16_4_ = 0x7f800000;
      auVar317._20_4_ = 0x7f800000;
      auVar317._24_4_ = 0x7f800000;
      auVar317._28_4_ = 0x7f800000;
      auVar88 = vblendvps_avx(auVar34,auVar317,auVar88);
      auVar298 = vmaxps_avx(auVar298,auVar329);
      auVar299 = vminps_avx(auVar299,auVar88);
      auVar313 = ZEXT1632(auVar86);
      auVar329 = vsubps_avx(auVar313,_local_940);
      auVar88 = vsubps_avx(auVar313,_local_840);
      auVar35._4_4_ = auVar88._4_4_ * -fVar99;
      auVar35._0_4_ = auVar88._0_4_ * -fVar72;
      auVar35._8_4_ = auVar88._8_4_ * -fVar103;
      auVar35._12_4_ = auVar88._12_4_ * -fVar106;
      auVar35._16_4_ = auVar88._16_4_ * -fVar109;
      auVar35._20_4_ = auVar88._20_4_ * -fVar112;
      auVar35._24_4_ = auVar88._24_4_ * -fVar115;
      auVar35._28_4_ = auVar88._28_4_;
      auVar36._4_4_ = fVar141 * auVar329._4_4_;
      auVar36._0_4_ = fVar119 * auVar329._0_4_;
      auVar36._8_4_ = fVar143 * auVar329._8_4_;
      auVar36._12_4_ = fVar146 * auVar329._12_4_;
      auVar36._16_4_ = fVar147 * auVar329._16_4_;
      auVar36._20_4_ = fVar148 * auVar329._20_4_;
      auVar36._24_4_ = fVar149 * auVar329._24_4_;
      auVar36._28_4_ = auVar329._28_4_;
      auVar329 = vsubps_avx(auVar35,auVar36);
      auVar88 = vsubps_avx(auVar313,local_7a0);
      auVar37._4_4_ = fVar347 * auVar88._4_4_;
      auVar37._0_4_ = fVar341 * auVar88._0_4_;
      auVar37._8_4_ = fVar349 * auVar88._8_4_;
      auVar37._12_4_ = fVar351 * auVar88._12_4_;
      auVar37._16_4_ = fVar353 * auVar88._16_4_;
      auVar37._20_4_ = fVar356 * auVar88._20_4_;
      uVar2 = auVar88._28_4_;
      auVar37._24_4_ = fVar359 * auVar88._24_4_;
      auVar37._28_4_ = uVar2;
      auVar344 = vsubps_avx(auVar329,auVar37);
      auVar38._4_4_ = auVar362._4_4_ * -fVar99;
      auVar38._0_4_ = auVar362._0_4_ * -fVar72;
      auVar38._8_4_ = auVar362._8_4_ * -fVar103;
      auVar38._12_4_ = auVar362._12_4_ * -fVar106;
      auVar38._16_4_ = auVar362._16_4_ * -fVar109;
      auVar38._20_4_ = auVar362._20_4_ * -fVar112;
      auVar38._24_4_ = auVar362._24_4_ * -fVar115;
      auVar38._28_4_ = local_7e0._28_4_ ^ 0x80000000;
      auVar39._4_4_ = auVar310._4_4_ * fVar141;
      auVar39._0_4_ = auVar310._0_4_ * fVar119;
      auVar39._8_4_ = auVar310._8_4_ * fVar143;
      auVar39._12_4_ = auVar310._12_4_ * fVar146;
      auVar39._16_4_ = auVar310._16_4_ * fVar147;
      auVar39._20_4_ = auVar310._20_4_ * fVar148;
      auVar39._24_4_ = auVar310._24_4_ * fVar149;
      auVar39._28_4_ = uVar2;
      auVar329 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar347 * fStack_6dc;
      auVar40._0_4_ = fVar341 * local_6e0;
      auVar40._8_4_ = fVar349 * fStack_6d8;
      auVar40._12_4_ = fVar351 * fStack_6d4;
      auVar40._16_4_ = fVar353 * fStack_6d0;
      auVar40._20_4_ = fVar356 * fStack_6cc;
      auVar40._24_4_ = fVar359 * fStack_6c8;
      auVar40._28_4_ = uVar2;
      auVar331._8_4_ = 0x3f800000;
      auVar331._0_8_ = 0x3f8000003f800000;
      auVar331._12_4_ = 0x3f800000;
      auVar331._16_4_ = 0x3f800000;
      auVar331._20_4_ = 0x3f800000;
      auVar331._24_4_ = 0x3f800000;
      auVar331._28_4_ = 0x3f800000;
      auVar13 = vsubps_avx(auVar329,auVar40);
      auVar329 = vrcpps_avx(auVar13);
      fVar245 = auVar329._0_4_;
      fVar190 = auVar329._4_4_;
      auVar41._4_4_ = auVar13._4_4_ * fVar190;
      auVar41._0_4_ = auVar13._0_4_ * fVar245;
      fVar248 = auVar329._8_4_;
      auVar41._8_4_ = auVar13._8_4_ * fVar248;
      fVar271 = auVar329._12_4_;
      auVar41._12_4_ = auVar13._12_4_ * fVar271;
      fVar274 = auVar329._16_4_;
      auVar41._16_4_ = auVar13._16_4_ * fVar274;
      fVar192 = auVar329._20_4_;
      auVar41._20_4_ = auVar13._20_4_ * fVar192;
      fVar196 = auVar329._24_4_;
      auVar41._24_4_ = auVar13._24_4_ * fVar196;
      auVar41._28_4_ = fStack_6c4;
      auVar14 = vsubps_avx(auVar331,auVar41);
      auVar329 = vandps_avx(auVar13,auVar293);
      auVar88 = vcmpps_avx(auVar329,auVar363,1);
      auVar268 = ZEXT3264(auVar88);
      auVar42._4_4_ = (fVar190 + fVar190 * auVar14._4_4_) * -auVar344._4_4_;
      auVar42._0_4_ = (fVar245 + fVar245 * auVar14._0_4_) * -auVar344._0_4_;
      auVar42._8_4_ = (fVar248 + fVar248 * auVar14._8_4_) * -auVar344._8_4_;
      auVar42._12_4_ = (fVar271 + fVar271 * auVar14._12_4_) * -auVar344._12_4_;
      auVar42._16_4_ = (fVar274 + fVar274 * auVar14._16_4_) * -auVar344._16_4_;
      auVar42._20_4_ = (fVar192 + fVar192 * auVar14._20_4_) * -auVar344._20_4_;
      auVar42._24_4_ = (fVar196 + fVar196 * auVar14._24_4_) * -auVar344._24_4_;
      auVar42._28_4_ = auVar344._28_4_ ^ 0x80000000;
      auVar329 = vcmpps_avx(auVar13,auVar313,1);
      auVar329 = vorps_avx(auVar88,auVar329);
      auVar329 = vblendvps_avx(auVar42,auVar300,auVar329);
      local_3c0 = vmaxps_avx(auVar298,auVar329);
      auVar298 = ZEXT1632(auVar86);
      auVar329 = vcmpps_avx(auVar13,auVar298,6);
      auVar329 = vorps_avx(auVar88,auVar329);
      auVar329 = vblendvps_avx(auVar42,auVar317,auVar329);
      auVar87 = vandps_avx(auVar87,local_360);
      local_460 = vminps_avx(auVar299,auVar329);
      auVar329 = vcmpps_avx(local_3c0,local_460,2);
      auVar88 = auVar87 & auVar329;
      if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar88 >> 0x7f,0) == '\0') &&
            (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar88 >> 0xbf,0) == '\0') &&
          (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar88[0x1f])
      goto LAB_00e422c7;
      auVar88 = vminps_avx(local_680,local_740);
      auVar299 = vminps_avx(local_6a0,_local_6c0);
      auVar88 = vminps_avx(auVar88,auVar299);
      auVar88 = vsubps_avx(auVar88,_local_5c0);
      auVar87 = vandps_avx(auVar329,auVar87);
      auVar329 = vminps_avx(_local_540,auVar331);
      auVar329 = vmaxps_avx(auVar329,ZEXT832(0) << 0x20);
      auVar296 = ZEXT3264(local_660);
      local_1a0[0] = fVar70 + fVar118 * (auVar329._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar97 + fVar140 * (auVar329._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar101 + fVar142 * (auVar329._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar104 + fVar145 * (auVar329._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar70 + fVar118 * (auVar329._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar97 + fVar140 * (auVar329._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar101 + fVar142 * (auVar329._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar104 + auVar329._28_4_ + 7.0;
      auVar59._4_4_ = fStack_55c;
      auVar59._0_4_ = local_560;
      auVar59._8_4_ = fStack_558;
      auVar59._12_4_ = fStack_554;
      auVar59._16_4_ = fStack_550;
      auVar59._20_4_ = fStack_54c;
      auVar59._24_4_ = fStack_548;
      auVar59._28_4_ = fStack_544;
      auVar329 = vminps_avx(auVar59,auVar331);
      auVar329 = vmaxps_avx(auVar329,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar70 + fVar118 * (auVar329._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar97 + fVar140 * (auVar329._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar101 + fVar142 * (auVar329._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar104 + fVar145 * (auVar329._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar70 + fVar118 * (auVar329._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar97 + fVar140 * (auVar329._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar101 + fVar142 * (auVar329._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar104 + auVar329._28_4_ + 7.0;
      auVar43._4_4_ = auVar88._4_4_ * 0.99999976;
      auVar43._0_4_ = auVar88._0_4_ * 0.99999976;
      auVar43._8_4_ = auVar88._8_4_ * 0.99999976;
      auVar43._12_4_ = auVar88._12_4_ * 0.99999976;
      auVar43._16_4_ = auVar88._16_4_ * 0.99999976;
      auVar43._20_4_ = auVar88._20_4_ * 0.99999976;
      auVar43._24_4_ = auVar88._24_4_ * 0.99999976;
      auVar43._28_4_ = 0x3f7ffffc;
      auVar329 = vmaxps_avx(auVar298,auVar43);
      auVar44._4_4_ = auVar329._4_4_ * auVar329._4_4_;
      auVar44._0_4_ = auVar329._0_4_ * auVar329._0_4_;
      auVar44._8_4_ = auVar329._8_4_ * auVar329._8_4_;
      auVar44._12_4_ = auVar329._12_4_ * auVar329._12_4_;
      auVar44._16_4_ = auVar329._16_4_ * auVar329._16_4_;
      auVar44._20_4_ = auVar329._20_4_ * auVar329._20_4_;
      auVar44._24_4_ = auVar329._24_4_ * auVar329._24_4_;
      auVar44._28_4_ = auVar329._28_4_;
      auVar88 = vsubps_avx(_local_760,auVar44);
      auVar45._4_4_ = auVar88._4_4_ * (float)local_5a0._4_4_;
      auVar45._0_4_ = auVar88._0_4_ * (float)local_5a0._0_4_;
      auVar45._8_4_ = auVar88._8_4_ * fStack_598;
      auVar45._12_4_ = auVar88._12_4_ * fStack_594;
      auVar45._16_4_ = auVar88._16_4_ * fStack_590;
      auVar45._20_4_ = auVar88._20_4_ * fStack_58c;
      auVar45._24_4_ = auVar88._24_4_ * fStack_588;
      auVar45._28_4_ = auVar329._28_4_;
      auVar299 = vsubps_avx(_local_580,auVar45);
      auVar329 = vcmpps_avx(auVar299,ZEXT832(0) << 0x20,5);
      if ((((((((auVar329 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar329 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar329 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar329 >> 0x7f,0) == '\0') &&
            (auVar329 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar329 >> 0xbf,0) == '\0') &&
          (auVar329 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar329[0x1f]) {
        _local_580 = ZEXT832(0) << 0x20;
        _local_5a0 = ZEXT832(0) << 0x20;
        _local_5c0 = ZEXT832(0) << 0x20;
        _local_b00 = local_5c0._0_28_;
        _local_940 = _local_5c0;
        _local_840 = _local_5c0;
        auVar212._8_4_ = 0x7f800000;
        auVar212._0_8_ = 0x7f8000007f800000;
        auVar212._12_4_ = 0x7f800000;
        auVar212._16_4_ = 0x7f800000;
        auVar212._20_4_ = 0x7f800000;
        auVar212._24_4_ = 0x7f800000;
        auVar212._28_4_ = 0x7f800000;
        auVar236._8_4_ = 0xff800000;
        auVar236._0_8_ = 0xff800000ff800000;
        auVar236._12_4_ = 0xff800000;
        auVar236._16_4_ = 0xff800000;
        auVar236._20_4_ = 0xff800000;
        auVar236._24_4_ = 0xff800000;
        auVar236._28_4_ = 0xff800000;
      }
      else {
        local_7a0 = auVar88;
        local_a20 = auVar329;
        _local_860 = auVar87;
        auVar13 = vsqrtps_avx(auVar299);
        auVar186._0_4_ = fVar326 + fVar326;
        auVar186._4_4_ = fVar107 + fVar107;
        auVar186._8_4_ = fVar110 + fVar110;
        auVar186._12_4_ = fVar113 + fVar113;
        auVar186._16_4_ = fVar116 + fVar116;
        auVar186._20_4_ = fVar308 + fVar308;
        auVar186._24_4_ = fVar309 + fVar309;
        auVar186._28_4_ = fVar222 + fVar222;
        auVar344 = vrcpps_avx(auVar186);
        fVar222 = auVar344._0_4_;
        fVar245 = auVar344._4_4_;
        auVar46._4_4_ = auVar186._4_4_ * fVar245;
        auVar46._0_4_ = auVar186._0_4_ * fVar222;
        fVar190 = auVar344._8_4_;
        auVar46._8_4_ = auVar186._8_4_ * fVar190;
        fVar248 = auVar344._12_4_;
        auVar46._12_4_ = auVar186._12_4_ * fVar248;
        fVar271 = auVar344._16_4_;
        auVar46._16_4_ = auVar186._16_4_ * fVar271;
        fVar274 = auVar344._20_4_;
        auVar46._20_4_ = auVar186._20_4_ * fVar274;
        fVar192 = auVar344._24_4_;
        auVar46._24_4_ = auVar186._24_4_ * fVar192;
        auVar46._28_4_ = auVar186._28_4_;
        auVar14 = vsubps_avx(auVar331,auVar46);
        fVar222 = fVar222 + fVar222 * auVar14._0_4_;
        fVar245 = fVar245 + fVar245 * auVar14._4_4_;
        fVar190 = fVar190 + fVar190 * auVar14._8_4_;
        fVar248 = fVar248 + fVar248 * auVar14._12_4_;
        fVar271 = fVar271 + fVar271 * auVar14._16_4_;
        fVar274 = fVar274 + fVar274 * auVar14._20_4_;
        fVar192 = fVar192 + fVar192 * auVar14._24_4_;
        fVar196 = auVar344._28_4_ + auVar14._28_4_;
        auVar237._0_8_ = local_340._0_8_ ^ 0x8000000080000000;
        auVar237._8_4_ = -local_340._8_4_;
        auVar237._12_4_ = -local_340._12_4_;
        auVar237._16_4_ = -local_340._16_4_;
        auVar237._20_4_ = -local_340._20_4_;
        auVar237._24_4_ = -local_340._24_4_;
        auVar237._28_4_ = -local_340._28_4_;
        auVar344 = vsubps_avx(auVar237,auVar13);
        fVar255 = auVar344._0_4_ * fVar222;
        fVar275 = auVar344._4_4_ * fVar245;
        auVar47._4_4_ = fVar275;
        auVar47._0_4_ = fVar255;
        fVar277 = auVar344._8_4_ * fVar190;
        auVar47._8_4_ = fVar277;
        fVar279 = auVar344._12_4_ * fVar248;
        auVar47._12_4_ = fVar279;
        fVar354 = auVar344._16_4_ * fVar271;
        auVar47._16_4_ = fVar354;
        fVar357 = auVar344._20_4_ * fVar274;
        auVar47._20_4_ = fVar357;
        fVar360 = auVar344._24_4_ * fVar192;
        auVar47._24_4_ = fVar360;
        auVar47._28_4_ = local_9a0._28_4_;
        auVar13 = vsubps_avx(auVar13,local_340);
        fVar222 = auVar13._0_4_ * fVar222;
        fVar245 = auVar13._4_4_ * fVar245;
        auVar48._4_4_ = fVar245;
        auVar48._0_4_ = fVar222;
        fVar190 = auVar13._8_4_ * fVar190;
        auVar48._8_4_ = fVar190;
        fVar248 = auVar13._12_4_ * fVar248;
        auVar48._12_4_ = fVar248;
        fVar271 = auVar13._16_4_ * fVar271;
        auVar48._16_4_ = fVar271;
        fVar274 = auVar13._20_4_ * fVar274;
        auVar48._20_4_ = fVar274;
        fVar192 = auVar13._24_4_ * fVar192;
        auVar48._24_4_ = fVar192;
        auVar48._28_4_ = 0x3f800000;
        fVar198 = (fVar255 * (float)local_5e0._0_4_ + auVar289._0_4_) * local_3e0;
        fVar216 = (fVar275 * (float)local_5e0._4_4_ + auVar289._4_4_) * fStack_3dc;
        fVar220 = (fVar277 * fStack_5d8 + auVar289._8_4_) * fStack_3d8;
        fVar221 = (fVar279 * fStack_5d4 + auVar289._12_4_) * fStack_3d4;
        fVar223 = (fVar354 * fStack_5d0 + auVar289._16_4_) * fStack_3d0;
        fVar251 = (fVar357 * fStack_5cc + auVar289._20_4_) * fStack_3cc;
        fVar253 = (fVar360 * fStack_5c8 + auVar289._24_4_) * fStack_3c8;
        auVar161._0_4_ = fVar71 + fVar198 * fVar189;
        auVar161._4_4_ = fVar98 + fVar216 * fVar269;
        auVar161._8_4_ = fVar102 + fVar220 * fVar195;
        auVar161._12_4_ = fVar105 + fVar221 * fVar219;
        auVar161._16_4_ = fVar108 + fVar223 * fVar249;
        auVar161._20_4_ = fVar111 + fVar251 * fVar272;
        auVar161._24_4_ = fVar114 + fVar253 * fVar11;
        auVar161._28_4_ = fVar117 + auVar13._28_4_ + auVar289._28_4_;
        auVar49._4_4_ = fVar275 * fStack_6dc;
        auVar49._0_4_ = fVar255 * local_6e0;
        auVar49._8_4_ = fVar277 * fStack_6d8;
        auVar49._12_4_ = fVar279 * fStack_6d4;
        auVar49._16_4_ = fVar354 * fStack_6d0;
        auVar49._20_4_ = fVar357 * fStack_6cc;
        auVar49._24_4_ = fVar360 * fStack_6c8;
        auVar49._28_4_ = fVar196;
        auVar13 = vsubps_avx(auVar49,auVar161);
        _local_b00 = auVar13._0_28_;
        auVar187._0_4_ = local_600._0_4_ + fVar168 * fVar198;
        auVar187._4_4_ = local_600._4_4_ + fVar191 * fVar216;
        auVar187._8_4_ = local_600._8_4_ + fVar193 * fVar220;
        auVar187._12_4_ = local_600._12_4_ + fVar217 * fVar221;
        auVar187._16_4_ = local_600._16_4_ + fVar243 * fVar223;
        auVar187._20_4_ = local_600._20_4_ + fVar259 * fVar251;
        auVar187._24_4_ = local_600._24_4_ + fVar281 * fVar253;
        auVar187._28_4_ = local_600._28_4_ + fVar196;
        auVar50._4_4_ = fVar275 * fStack_6fc;
        auVar50._0_4_ = fVar255 * local_700;
        auVar50._8_4_ = fVar277 * fStack_6f8;
        auVar50._12_4_ = fVar279 * fStack_6f4;
        auVar50._16_4_ = fVar354 * fStack_6f0;
        auVar50._20_4_ = fVar357 * fStack_6ec;
        auVar50._24_4_ = fVar360 * fStack_6e8;
        auVar50._28_4_ = fVar104;
        _local_940 = vsubps_avx(auVar50,auVar187);
        auVar238._0_4_ = local_4e0._0_4_ + fVar242 * fVar198;
        auVar238._4_4_ = local_4e0._4_4_ + fVar258 * fVar216;
        auVar238._8_4_ = local_4e0._8_4_ + fVar194 * fVar220;
        auVar238._12_4_ = local_4e0._12_4_ + fVar218 * fVar221;
        auVar238._16_4_ = local_4e0._16_4_ + fVar246 * fVar223;
        auVar238._20_4_ = local_4e0._20_4_ + fVar270 * fVar251;
        auVar238._24_4_ = local_4e0._24_4_ + fVar325 * fVar253;
        auVar238._28_4_ = local_4e0._28_4_ + auVar344._28_4_;
        auVar51._4_4_ = fVar275 * fStack_71c;
        auVar51._0_4_ = fVar255 * local_720;
        auVar51._8_4_ = fVar277 * fStack_718;
        auVar51._12_4_ = fVar279 * fStack_714;
        auVar51._16_4_ = fVar354 * fStack_710;
        auVar51._20_4_ = fVar357 * fStack_70c;
        auVar51._24_4_ = fVar360 * fStack_708;
        auVar51._28_4_ = fVar104;
        _local_840 = vsubps_avx(auVar51,auVar238);
        fVar196 = (fVar222 * (float)local_5e0._0_4_ + auVar289._0_4_) * local_3e0;
        fVar198 = (fVar245 * (float)local_5e0._4_4_ + auVar289._4_4_) * fStack_3dc;
        fVar216 = (fVar190 * fStack_5d8 + auVar289._8_4_) * fStack_3d8;
        fVar220 = (fVar248 * fStack_5d4 + auVar289._12_4_) * fStack_3d4;
        fVar221 = (fVar271 * fStack_5d0 + auVar289._16_4_) * fStack_3d0;
        fVar223 = (fVar274 * fStack_5cc + auVar289._20_4_) * fStack_3cc;
        fVar251 = (fVar192 * fStack_5c8 + auVar289._24_4_) * fStack_3c8;
        auVar266._0_4_ = fVar71 + fVar196 * fVar189;
        auVar266._4_4_ = fVar98 + fVar198 * fVar269;
        auVar266._8_4_ = fVar102 + fVar216 * fVar195;
        auVar266._12_4_ = fVar105 + fVar220 * fVar219;
        auVar266._16_4_ = fVar108 + fVar221 * fVar249;
        auVar266._20_4_ = fVar111 + fVar223 * fVar272;
        auVar266._24_4_ = fVar114 + fVar251 * fVar11;
        auVar266._28_4_ = fVar117 + fVar104;
        auVar52._4_4_ = fVar245 * fStack_6dc;
        auVar52._0_4_ = fVar222 * local_6e0;
        auVar52._8_4_ = fVar190 * fStack_6d8;
        auVar52._12_4_ = fVar248 * fStack_6d4;
        auVar52._16_4_ = fVar271 * fStack_6d0;
        auVar52._20_4_ = fVar274 * fStack_6cc;
        auVar52._24_4_ = fVar192 * fStack_6c8;
        auVar52._28_4_ = fStack_6c4;
        _local_580 = vsubps_avx(auVar52,auVar266);
        auVar267._0_4_ = local_600._0_4_ + fVar168 * fVar196;
        auVar267._4_4_ = local_600._4_4_ + fVar191 * fVar198;
        auVar267._8_4_ = local_600._8_4_ + fVar193 * fVar216;
        auVar267._12_4_ = local_600._12_4_ + fVar217 * fVar220;
        auVar267._16_4_ = local_600._16_4_ + fVar243 * fVar221;
        auVar267._20_4_ = local_600._20_4_ + fVar259 * fVar223;
        auVar267._24_4_ = local_600._24_4_ + fVar281 * fVar251;
        auVar267._28_4_ = local_600._28_4_ + local_580._28_4_;
        auVar53._4_4_ = fVar245 * fStack_6fc;
        auVar53._0_4_ = fVar222 * local_700;
        auVar53._8_4_ = fVar190 * fStack_6f8;
        auVar53._12_4_ = fVar248 * fStack_6f4;
        auVar53._16_4_ = fVar271 * fStack_6f0;
        auVar53._20_4_ = fVar274 * fStack_6ec;
        auVar53._24_4_ = fVar192 * fStack_6e8;
        auVar53._28_4_ = fStack_6c4;
        _local_5a0 = vsubps_avx(auVar53,auVar267);
        auVar239._0_4_ = local_4e0._0_4_ + fVar242 * fVar196;
        auVar239._4_4_ = local_4e0._4_4_ + fVar258 * fVar198;
        auVar239._8_4_ = local_4e0._8_4_ + fVar194 * fVar216;
        auVar239._12_4_ = local_4e0._12_4_ + fVar218 * fVar220;
        auVar239._16_4_ = local_4e0._16_4_ + fVar246 * fVar221;
        auVar239._20_4_ = local_4e0._20_4_ + fVar270 * fVar223;
        auVar239._24_4_ = local_4e0._24_4_ + fVar325 * fVar251;
        auVar239._28_4_ = local_4e0._28_4_ + local_840._28_4_ + auVar289._28_4_;
        auVar54._4_4_ = fVar245 * fStack_71c;
        auVar54._0_4_ = fVar222 * local_720;
        auVar54._8_4_ = fVar190 * fStack_718;
        auVar54._12_4_ = fVar248 * fStack_714;
        auVar54._16_4_ = fVar271 * fStack_710;
        auVar54._20_4_ = fVar274 * fStack_70c;
        auVar54._24_4_ = fVar192 * fStack_708;
        auVar54._28_4_ = auVar267._28_4_;
        _local_5c0 = vsubps_avx(auVar54,auVar239);
        auVar299 = vcmpps_avx(auVar299,auVar298,5);
        auVar213._8_4_ = 0x7f800000;
        auVar213._0_8_ = 0x7f8000007f800000;
        auVar213._12_4_ = 0x7f800000;
        auVar213._16_4_ = 0x7f800000;
        auVar213._20_4_ = 0x7f800000;
        auVar213._24_4_ = 0x7f800000;
        auVar213._28_4_ = 0x7f800000;
        auVar212 = vblendvps_avx(auVar213,auVar47,auVar299);
        auVar294._8_4_ = 0x7fffffff;
        auVar294._0_8_ = 0x7fffffff7fffffff;
        auVar294._12_4_ = 0x7fffffff;
        auVar294._16_4_ = 0x7fffffff;
        auVar294._20_4_ = 0x7fffffff;
        auVar294._24_4_ = 0x7fffffff;
        auVar294._28_4_ = 0x7fffffff;
        auVar298 = vandps_avx(auVar294,local_320);
        auVar298 = vmaxps_avx(local_3a0,auVar298);
        auVar55._4_4_ = auVar298._4_4_ * 1.9073486e-06;
        auVar55._0_4_ = auVar298._0_4_ * 1.9073486e-06;
        auVar55._8_4_ = auVar298._8_4_ * 1.9073486e-06;
        auVar55._12_4_ = auVar298._12_4_ * 1.9073486e-06;
        auVar55._16_4_ = auVar298._16_4_ * 1.9073486e-06;
        auVar55._20_4_ = auVar298._20_4_ * 1.9073486e-06;
        auVar55._24_4_ = auVar298._24_4_ * 1.9073486e-06;
        auVar55._28_4_ = auVar298._28_4_;
        auVar298 = vandps_avx(auVar294,local_400);
        auVar298 = vcmpps_avx(auVar298,auVar55,1);
        auVar296 = ZEXT3264(auVar298);
        auVar240._8_4_ = 0xff800000;
        auVar240._0_8_ = 0xff800000ff800000;
        auVar240._12_4_ = 0xff800000;
        auVar240._16_4_ = 0xff800000;
        auVar240._20_4_ = 0xff800000;
        auVar240._24_4_ = 0xff800000;
        auVar240._28_4_ = 0xff800000;
        auVar236 = vblendvps_avx(auVar240,auVar48,auVar299);
        auVar344 = auVar299 & auVar298;
        if ((((((((auVar344 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar344 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar344 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar344 >> 0x7f,0) != '\0') ||
              (auVar344 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar344 >> 0xbf,0) != '\0') ||
            (auVar344 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar344[0x1f] < '\0') {
          auVar329 = vandps_avx(auVar298,auVar299);
          auVar86 = vpackssdw_avx(auVar329._0_16_,auVar329._16_16_);
          auVar344 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar298 = vcmpps_avx(auVar88,auVar344,2);
          auVar364._8_4_ = 0xff800000;
          auVar364._0_8_ = 0xff800000ff800000;
          auVar364._12_4_ = 0xff800000;
          auVar364._16_4_ = 0xff800000;
          auVar364._20_4_ = 0xff800000;
          auVar364._24_4_ = 0xff800000;
          auVar364._28_4_ = 0xff800000;
          auVar366._8_4_ = 0x7f800000;
          auVar366._0_8_ = 0x7f8000007f800000;
          auVar366._12_4_ = 0x7f800000;
          auVar366._16_4_ = 0x7f800000;
          auVar366._20_4_ = 0x7f800000;
          auVar366._24_4_ = 0x7f800000;
          auVar366._28_4_ = 0x7f800000;
          auVar88 = vblendvps_avx(auVar366,auVar364,auVar298);
          auVar12 = vpmovsxwd_avx(auVar86);
          auVar86 = vpunpckhwd_avx(auVar86,auVar86);
          auVar295._16_16_ = auVar86;
          auVar295._0_16_ = auVar12;
          auVar212 = vblendvps_avx(auVar212,auVar88,auVar295);
          auVar88 = vblendvps_avx(auVar364,auVar366,auVar298);
          auVar236 = vblendvps_avx(auVar236,auVar88,auVar295);
          auVar88 = vcmpps_avx(auVar344,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
          auVar296 = ZEXT3264(auVar88);
          auVar96._0_4_ = auVar329._0_4_ ^ auVar88._0_4_;
          auVar96._4_4_ = auVar329._4_4_ ^ auVar88._4_4_;
          auVar96._8_4_ = auVar329._8_4_ ^ auVar88._8_4_;
          auVar96._12_4_ = auVar329._12_4_ ^ auVar88._12_4_;
          auVar96._16_4_ = auVar329._16_4_ ^ auVar88._16_4_;
          auVar96._20_4_ = auVar329._20_4_ ^ auVar88._20_4_;
          auVar96._24_4_ = auVar329._24_4_ ^ auVar88._24_4_;
          auVar96._28_4_ = auVar329._28_4_ ^ auVar88._28_4_;
          auVar329 = vorps_avx(auVar298,auVar96);
          auVar329 = vandps_avx(auVar299,auVar329);
        }
      }
      auVar367 = ZEXT3264(local_9c0);
      auVar365 = ZEXT3264(local_900);
      auVar345 = ZEXT3264(local_9a0);
      auVar318 = ZEXT3264(local_a00);
      auVar314 = ZEXT3264(local_9e0);
      fVar222 = (ray->super_RayK<1>).dir.field_0.m128[0];
      auVar263._4_4_ = fVar222;
      auVar263._0_4_ = fVar222;
      auVar263._8_4_ = fVar222;
      auVar263._12_4_ = fVar222;
      auVar263._16_4_ = fVar222;
      auVar263._20_4_ = fVar222;
      auVar263._24_4_ = fVar222;
      local_740._28_4_ = fVar222;
      local_740._0_28_ = auVar263;
      auVar268 = ZEXT3264(local_740);
      fVar168 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar242 = (ray->super_RayK<1>).dir.field_0.m128[2];
      local_440 = local_3c0;
      local_420 = vminps_avx(local_460,auVar212);
      _local_480 = vmaxps_avx(local_3c0,auVar236);
      auVar88 = vcmpps_avx(local_3c0,local_420,2);
      _local_5e0 = vandps_avx(auVar87,auVar88);
      auVar88 = vcmpps_avx(_local_480,local_460,2);
      local_500 = vandps_avx(auVar87,auVar88);
      auVar87 = vorps_avx(local_500,_local_5e0);
      if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar87 >> 0x7f,0) == '\0') &&
            (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar87 >> 0xbf,0) == '\0') &&
          (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar87[0x1f])
      goto LAB_00e422f4;
      local_600 = _local_480;
      auVar87 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_520._0_4_ = auVar329._0_4_ ^ auVar87._0_4_;
      local_520._4_4_ = auVar329._4_4_ ^ auVar87._4_4_;
      local_520._8_4_ = auVar329._8_4_ ^ auVar87._8_4_;
      local_520._12_4_ = auVar329._12_4_ ^ auVar87._12_4_;
      local_520._16_4_ = auVar329._16_4_ ^ auVar87._16_4_;
      local_520._20_4_ = auVar329._20_4_ ^ auVar87._20_4_;
      local_520._24_4_ = auVar329._24_4_ ^ auVar87._24_4_;
      local_520._28_4_ = (uint)auVar329._28_4_ ^ (uint)auVar87._28_4_;
      auVar91._0_4_ =
           fVar222 * (float)local_b00._0_4_ +
           fVar168 * (float)local_940._0_4_ + fVar242 * (float)local_840._0_4_;
      auVar91._4_4_ =
           fVar222 * (float)local_b00._4_4_ +
           fVar168 * (float)local_940._4_4_ + fVar242 * (float)local_840._4_4_;
      auVar91._8_4_ = fVar222 * fStack_af8 + fVar168 * fStack_938 + fVar242 * fStack_838;
      auVar91._12_4_ = fVar222 * fStack_af4 + fVar168 * fStack_934 + fVar242 * fStack_834;
      auVar91._16_4_ = fVar222 * fStack_af0 + fVar168 * fStack_930 + fVar242 * fStack_830;
      auVar91._20_4_ = fVar222 * fStack_aec + fVar168 * fStack_92c + fVar242 * fStack_82c;
      auVar91._24_4_ = fVar222 * fStack_ae8 + fVar168 * fStack_928 + fVar242 * fStack_828;
      auVar91._28_4_ = auVar329._28_4_ + auVar87._28_4_ + local_480._28_4_;
      auVar135._8_4_ = 0x7fffffff;
      auVar135._0_8_ = 0x7fffffff7fffffff;
      auVar135._12_4_ = 0x7fffffff;
      auVar135._16_4_ = 0x7fffffff;
      auVar135._20_4_ = 0x7fffffff;
      auVar135._24_4_ = 0x7fffffff;
      auVar135._28_4_ = 0x7fffffff;
      auVar87 = vandps_avx(auVar91,auVar135);
      auVar136._8_4_ = 0x3e99999a;
      auVar136._0_8_ = 0x3e99999a3e99999a;
      auVar136._12_4_ = 0x3e99999a;
      auVar136._16_4_ = 0x3e99999a;
      auVar136._20_4_ = 0x3e99999a;
      auVar136._24_4_ = 0x3e99999a;
      auVar136._28_4_ = 0x3e99999a;
      auVar87 = vcmpps_avx(auVar87,auVar136,1);
      auVar87 = vorps_avx(auVar87,local_520);
      auVar137._8_4_ = 3;
      auVar137._0_8_ = 0x300000003;
      auVar137._12_4_ = 3;
      auVar137._16_4_ = 3;
      auVar137._20_4_ = 3;
      auVar137._24_4_ = 3;
      auVar137._28_4_ = 3;
      auVar162._8_4_ = 2;
      auVar162._0_8_ = 0x200000002;
      auVar162._12_4_ = 2;
      auVar162._16_4_ = 2;
      auVar162._20_4_ = 2;
      auVar162._24_4_ = 2;
      auVar162._28_4_ = 2;
      auVar87 = vblendvps_avx(auVar162,auVar137,auVar87);
      _local_540 = ZEXT432(local_b0c);
      auVar12 = vpshufd_avx(ZEXT416(local_b0c),0);
      fVar222 = 0.0;
      auVar86 = vpcmpgtd_avx(auVar87._16_16_,auVar12);
      local_560 = auVar12._0_4_;
      fStack_55c = auVar12._4_4_;
      fStack_558 = auVar12._8_4_;
      fStack_554 = auVar12._12_4_;
      auVar12 = vpcmpgtd_avx(auVar87._0_16_,auVar12);
      auVar138._16_16_ = auVar86;
      auVar138._0_16_ = auVar12;
      local_4e0 = vblendps_avx(ZEXT1632(auVar12),auVar138,0xf0);
      local_4c0 = vandnps_avx(local_4e0,_local_5e0);
      auVar268 = ZEXT3264(local_4c0);
      auVar87 = _local_5e0 & ~local_4e0;
      local_7e0 = auVar15;
      if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar87 >> 0x7f,0) == '\0') &&
            (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar87 >> 0xbf,0) == '\0') &&
          (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar87[0x1f])
      {
        fVar189 = (ray->super_RayK<1>).tfar;
        auVar92._4_4_ = fVar189;
        auVar92._0_4_ = fVar189;
        auVar92._8_4_ = fVar189;
        auVar92._12_4_ = fVar189;
        auVar92._16_4_ = fVar189;
        auVar92._20_4_ = fVar189;
        auVar92._24_4_ = fVar189;
        auVar92._28_4_ = fVar189;
        auVar307 = ZEXT3264(local_920);
        fVar189 = fVar242;
        fVar245 = fVar242;
        fVar190 = fVar242;
        fVar248 = fVar242;
        fVar191 = fVar242;
        fVar258 = fVar242;
        fVar269 = fVar168;
        fVar271 = fVar168;
        fVar274 = fVar168;
        fVar192 = fVar168;
        fVar193 = fVar168;
        fVar194 = fVar168;
      }
      else {
        local_760._4_4_ = local_3c0._4_4_ + (float)local_640._4_4_;
        local_760._0_4_ = local_3c0._0_4_ + (float)local_640._0_4_;
        fStack_758 = local_3c0._8_4_ + fStack_638;
        fStack_754 = local_3c0._12_4_ + fStack_634;
        fStack_750 = local_3c0._16_4_ + fStack_630;
        fStack_74c = local_3c0._20_4_ + fStack_62c;
        fStack_748 = local_3c0._24_4_ + fStack_628;
        fStack_744 = local_3c0._28_4_ + fStack_624;
        local_880._4_4_ = fVar168;
        local_880._0_4_ = fVar168;
        fStack_878 = fVar168;
        fStack_874 = fVar168;
        fStack_870 = fVar168;
        fStack_86c = fVar168;
        fStack_868 = fVar168;
        fStack_864 = fVar168;
        local_820._4_4_ = fVar242;
        local_820._0_4_ = fVar242;
        fStack_818 = fVar242;
        fStack_814 = fVar242;
        fStack_810 = fVar242;
        fStack_80c = fVar242;
        fStack_808 = fVar242;
        fStack_804 = fVar242;
        do {
          auVar93._8_4_ = 0x7f800000;
          auVar93._0_8_ = 0x7f8000007f800000;
          auVar93._12_4_ = 0x7f800000;
          auVar93._16_4_ = 0x7f800000;
          auVar93._20_4_ = 0x7f800000;
          auVar93._24_4_ = 0x7f800000;
          auVar93._28_4_ = 0x7f800000;
          auVar87 = auVar268._0_32_;
          auVar329 = vblendvps_avx(auVar93,local_3c0,auVar87);
          auVar88 = vshufps_avx(auVar329,auVar329,0xb1);
          auVar88 = vminps_avx(auVar329,auVar88);
          auVar298 = vshufpd_avx(auVar88,auVar88,5);
          auVar88 = vminps_avx(auVar88,auVar298);
          auVar298 = vperm2f128_avx(auVar88,auVar88,1);
          auVar88 = vminps_avx(auVar88,auVar298);
          auVar329 = vcmpps_avx(auVar329,auVar88,0);
          auVar88 = auVar87 & auVar329;
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0x7f,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0xbf,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar88[0x1f] < '\0') {
            auVar87 = vandps_avx(auVar329,auVar87);
          }
          uVar61 = vmovmskps_avx(auVar87);
          uVar64 = 0;
          if (uVar61 != 0) {
            for (; (uVar61 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
            }
          }
          uVar62 = (ulong)uVar64;
          *(undefined4 *)(local_4c0 + uVar62 * 4) = 0;
          aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
          auVar86 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
          fVar222 = local_1a0[uVar62];
          uVar64 = *(uint *)(local_440 + uVar62 * 4);
          if (auVar86._0_4_ < 0.0) {
            fVar168 = sqrtf(auVar86._0_4_);
          }
          else {
            auVar86 = vsqrtss_avx(auVar86,auVar86);
            fVar168 = auVar86._0_4_;
          }
          auVar12 = vminps_avx(_local_950,_local_970);
          auVar86 = vmaxps_avx(_local_950,_local_970);
          auVar79 = vminps_avx(_local_960,_local_980);
          auVar83 = vminps_avx(auVar12,auVar79);
          auVar12 = vmaxps_avx(_local_960,_local_980);
          auVar79 = vmaxps_avx(auVar86,auVar12);
          auVar171._8_4_ = 0x7fffffff;
          auVar171._0_8_ = 0x7fffffff7fffffff;
          auVar171._12_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar83,auVar171);
          auVar12 = vandps_avx(auVar79,auVar171);
          auVar86 = vmaxps_avx(auVar86,auVar12);
          auVar12 = vmovshdup_avx(auVar86);
          auVar12 = vmaxss_avx(auVar12,auVar86);
          auVar86 = vshufpd_avx(auVar86,auVar86,1);
          auVar86 = vmaxss_avx(auVar86,auVar12);
          local_940._0_4_ = auVar86._0_4_ * 1.9073486e-06;
          local_7e0._0_4_ = fVar168 * 1.9073486e-06;
          _local_6c0 = vshufps_avx(auVar79,auVar79,0xff);
          auVar86 = vinsertps_avx(ZEXT416(uVar64),ZEXT416((uint)fVar222),0x10);
          lVar67 = 5;
          do {
            auVar12 = vmovshdup_avx(auVar86);
            fVar192 = auVar12._0_4_;
            local_a20._0_4_ = 1.0 - fVar192;
            auVar12 = vshufps_avx(auVar86,auVar86,0x55);
            fVar222 = auVar12._0_4_;
            fVar168 = auVar12._4_4_;
            fVar242 = auVar12._8_4_;
            fVar189 = auVar12._12_4_;
            auVar12 = vshufps_avx(ZEXT416((uint)local_a20._0_4_),ZEXT416((uint)local_a20._0_4_),0);
            fVar245 = auVar12._0_4_;
            fVar190 = auVar12._4_4_;
            fVar248 = auVar12._8_4_;
            fVar191 = auVar12._12_4_;
            fVar258 = (float)local_960._0_4_ * fVar222 + (float)local_970._0_4_ * fVar245;
            fVar269 = (float)local_960._4_4_ * fVar168 + (float)local_970._4_4_ * fVar190;
            fVar271 = fStack_958 * fVar242 + fStack_968 * fVar248;
            fVar274 = fStack_954 * fVar189 + fStack_964 * fVar191;
            auVar227._0_4_ =
                 fVar245 * ((float)local_970._0_4_ * fVar222 + fVar245 * (float)local_950._0_4_) +
                 fVar222 * fVar258;
            auVar227._4_4_ =
                 fVar190 * ((float)local_970._4_4_ * fVar168 + fVar190 * (float)local_950._4_4_) +
                 fVar168 * fVar269;
            auVar227._8_4_ =
                 fVar248 * (fStack_968 * fVar242 + fVar248 * fStack_948) + fVar242 * fVar271;
            auVar227._12_4_ =
                 fVar191 * (fStack_964 * fVar189 + fVar191 * fStack_944) + fVar189 * fVar274;
            auVar172._0_4_ =
                 fVar245 * fVar258 +
                 fVar222 * (fVar222 * (float)local_980._0_4_ + (float)local_960._0_4_ * fVar245);
            auVar172._4_4_ =
                 fVar190 * fVar269 +
                 fVar168 * (fVar168 * (float)local_980._4_4_ + (float)local_960._4_4_ * fVar190);
            auVar172._8_4_ =
                 fVar248 * fVar271 + fVar242 * (fVar242 * fStack_978 + fStack_958 * fVar248);
            auVar172._12_4_ =
                 fVar191 * fVar274 + fVar189 * (fVar189 * fStack_974 + fStack_954 * fVar191);
            auVar12 = vshufps_avx(auVar86,auVar86,0);
            local_ac0 = aVar4.x;
            fStack_abc = aVar4.y;
            fStack_ab8 = aVar4.z;
            aStack_ab4 = aVar4.field_3;
            auVar122._0_4_ = auVar12._0_4_ * local_ac0 + 0.0;
            auVar122._4_4_ = auVar12._4_4_ * fStack_abc + 0.0;
            auVar122._8_4_ = auVar12._8_4_ * fStack_ab8 + 0.0;
            auVar122._12_4_ = auVar12._12_4_ * aStack_ab4.w + 0.0;
            auVar78._0_4_ = fVar245 * auVar227._0_4_ + fVar222 * auVar172._0_4_;
            auVar78._4_4_ = fVar190 * auVar227._4_4_ + fVar168 * auVar172._4_4_;
            auVar78._8_4_ = fVar248 * auVar227._8_4_ + fVar242 * auVar172._8_4_;
            auVar78._12_4_ = fVar191 * auVar227._12_4_ + fVar189 * auVar172._12_4_;
            local_7a0._0_16_ = auVar78;
            auVar12 = vsubps_avx(auVar122,auVar78);
            _local_860 = auVar12;
            auVar12 = vdpps_avx(auVar12,auVar12,0x7f);
            _local_840 = auVar12;
            if (auVar12._0_4_ < 0.0) {
              local_a20._0_16_ = ZEXT416((uint)local_a20._0_4_);
              local_a40._0_16_ = auVar227;
              local_a60._0_16_ = auVar172;
              fVar222 = sqrtf(auVar12._0_4_);
              auVar172 = local_a60._0_16_;
              auVar227 = local_a40._0_16_;
            }
            else {
              auVar12 = vsqrtss_avx(auVar12,auVar12);
              fVar222 = auVar12._0_4_;
            }
            auVar12 = vsubps_avx(auVar172,auVar227);
            auVar286._0_4_ = auVar12._0_4_ * 3.0;
            auVar286._4_4_ = auVar12._4_4_ * 3.0;
            auVar286._8_4_ = auVar12._8_4_ * 3.0;
            auVar286._12_4_ = auVar12._12_4_ * 3.0;
            auVar12 = vshufps_avx(ZEXT416((uint)(fVar192 * 6.0)),ZEXT416((uint)(fVar192 * 6.0)),0);
            auVar79 = ZEXT416((uint)(((float)local_a20._0_4_ - (fVar192 + fVar192)) * 6.0));
            auVar83 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)((fVar192 - ((float)local_a20._0_4_ + (float)local_a20._0_4_)) *
                                    6.0));
            auVar156 = vshufps_avx(auVar79,auVar79,0);
            auVar179 = vshufps_avx(ZEXT416((uint)((float)local_a20._0_4_ * 6.0)),
                                   ZEXT416((uint)((float)local_a20._0_4_ * 6.0)),0);
            auVar79 = vdpps_avx(auVar286,auVar286,0x7f);
            auVar123._0_4_ =
                 auVar179._0_4_ * (float)local_950._0_4_ +
                 auVar156._0_4_ * (float)local_970._0_4_ +
                 auVar12._0_4_ * (float)local_980._0_4_ + auVar83._0_4_ * (float)local_960._0_4_;
            auVar123._4_4_ =
                 auVar179._4_4_ * (float)local_950._4_4_ +
                 auVar156._4_4_ * (float)local_970._4_4_ +
                 auVar12._4_4_ * (float)local_980._4_4_ + auVar83._4_4_ * (float)local_960._4_4_;
            auVar123._8_4_ =
                 auVar179._8_4_ * fStack_948 +
                 auVar156._8_4_ * fStack_968 +
                 auVar12._8_4_ * fStack_978 + auVar83._8_4_ * fStack_958;
            auVar123._12_4_ =
                 auVar179._12_4_ * fStack_944 +
                 auVar156._12_4_ * fStack_964 +
                 auVar12._12_4_ * fStack_974 + auVar83._12_4_ * fStack_954;
            auVar12 = vblendps_avx(auVar79,_DAT_01f7aa10,0xe);
            auVar83 = vrsqrtss_avx(auVar12,auVar12);
            fVar242 = auVar83._0_4_;
            fVar168 = auVar79._0_4_;
            auVar83 = vdpps_avx(auVar286,auVar123,0x7f);
            auVar156 = vshufps_avx(auVar79,auVar79,0);
            auVar124._0_4_ = auVar123._0_4_ * auVar156._0_4_;
            auVar124._4_4_ = auVar123._4_4_ * auVar156._4_4_;
            auVar124._8_4_ = auVar123._8_4_ * auVar156._8_4_;
            auVar124._12_4_ = auVar123._12_4_ * auVar156._12_4_;
            auVar83 = vshufps_avx(auVar83,auVar83,0);
            auVar202._0_4_ = auVar286._0_4_ * auVar83._0_4_;
            auVar202._4_4_ = auVar286._4_4_ * auVar83._4_4_;
            auVar202._8_4_ = auVar286._8_4_ * auVar83._8_4_;
            auVar202._12_4_ = auVar286._12_4_ * auVar83._12_4_;
            auVar179 = vsubps_avx(auVar124,auVar202);
            auVar83 = vrcpss_avx(auVar12,auVar12);
            auVar12 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                 ZEXT416((uint)(auVar86._0_4_ * (float)local_7e0._0_4_)));
            auVar83 = ZEXT416((uint)(auVar83._0_4_ * (2.0 - fVar168 * auVar83._0_4_)));
            auVar83 = vshufps_avx(auVar83,auVar83,0);
            uVar62 = CONCAT44(auVar286._4_4_,auVar286._0_4_);
            auVar303._0_8_ = uVar62 ^ 0x8000000080000000;
            auVar303._8_4_ = -auVar286._8_4_;
            auVar303._12_4_ = -auVar286._12_4_;
            auVar156 = ZEXT416((uint)(fVar242 * 1.5 + fVar168 * -0.5 * fVar242 * fVar242 * fVar242))
            ;
            auVar156 = vshufps_avx(auVar156,auVar156,0);
            auVar173._0_4_ = auVar156._0_4_ * auVar179._0_4_ * auVar83._0_4_;
            auVar173._4_4_ = auVar156._4_4_ * auVar179._4_4_ * auVar83._4_4_;
            auVar173._8_4_ = auVar156._8_4_ * auVar179._8_4_ * auVar83._8_4_;
            auVar173._12_4_ = auVar156._12_4_ * auVar179._12_4_ * auVar83._12_4_;
            local_a20._0_16_ = auVar286;
            local_7c0._0_4_ = auVar286._0_4_ * auVar156._0_4_;
            local_7c0._4_4_ = auVar286._4_4_ * auVar156._4_4_;
            local_7c0._8_4_ = auVar286._8_4_ * auVar156._8_4_;
            local_7c0._12_4_ = auVar286._12_4_ * auVar156._12_4_;
            if (fVar168 < 0.0) {
              local_a40._0_4_ = fVar222;
              local_a60._0_16_ = auVar303;
              local_800._0_16_ = auVar173;
              fVar168 = sqrtf(fVar168);
              auVar173 = local_800._0_16_;
              auVar303 = local_a60._0_16_;
            }
            else {
              auVar79 = vsqrtss_avx(auVar79,auVar79);
              fVar168 = auVar79._0_4_;
              local_a40._0_4_ = fVar222;
            }
            auVar79 = vdpps_avx(_local_860,local_7c0._0_16_,0x7f);
            local_a60._0_4_ =
                 ((float)local_940._0_4_ / fVar168) * ((float)local_a40._0_4_ + 1.0) +
                 (float)local_a40._0_4_ * (float)local_940._0_4_ + auVar12._0_4_;
            auVar83 = vdpps_avx(auVar303,local_7c0._0_16_,0x7f);
            auVar156 = vdpps_avx(_local_860,auVar173,0x7f);
            auVar179 = vdpps_avx((undefined1  [16])aVar4,local_7c0._0_16_,0x7f);
            auVar81 = vdpps_avx(_local_860,auVar303,0x7f);
            fVar222 = auVar83._0_4_ + auVar156._0_4_;
            fVar168 = auVar79._0_4_;
            auVar80._0_4_ = fVar168 * fVar168;
            auVar80._4_4_ = auVar79._4_4_ * auVar79._4_4_;
            auVar80._8_4_ = auVar79._8_4_ * auVar79._8_4_;
            auVar80._12_4_ = auVar79._12_4_ * auVar79._12_4_;
            auVar156 = vsubps_avx(_local_840,auVar80);
            local_7c0._0_16_ = ZEXT416((uint)fVar222);
            auVar83 = vdpps_avx(_local_860,(undefined1  [16])aVar4,0x7f);
            fVar242 = auVar81._0_4_ - fVar168 * fVar222;
            local_a40._0_16_ = auVar79;
            fVar168 = auVar83._0_4_ - fVar168 * auVar179._0_4_;
            auVar79 = vrsqrtss_avx(auVar156,auVar156);
            fVar189 = auVar156._0_4_;
            fVar222 = auVar79._0_4_;
            fVar222 = fVar222 * 1.5 + fVar189 * -0.5 * fVar222 * fVar222 * fVar222;
            if (fVar189 < 0.0) {
              local_800._0_16_ = auVar179;
              local_660._0_4_ = fVar242;
              local_680._0_4_ = fVar168;
              local_6a0._0_4_ = fVar222;
              fVar189 = sqrtf(fVar189);
              fVar222 = (float)local_6a0._0_4_;
              fVar242 = (float)local_660._0_4_;
              fVar168 = (float)local_680._0_4_;
              auVar179 = local_800._0_16_;
            }
            else {
              auVar79 = vsqrtss_avx(auVar156,auVar156);
              fVar189 = auVar79._0_4_;
            }
            auVar367 = ZEXT3264(local_9c0);
            auVar314 = ZEXT3264(local_9e0);
            auVar318 = ZEXT3264(local_a00);
            auVar296 = ZEXT3264(local_900);
            auVar345 = ZEXT3264(local_9a0);
            auVar307 = ZEXT3264(local_920);
            auVar81 = vpermilps_avx(local_7a0._0_16_,0xff);
            auVar74 = vpermilps_avx(local_a20._0_16_,0xff);
            fVar242 = fVar242 * fVar222 - auVar74._0_4_;
            auVar203._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
            auVar203._8_4_ = auVar179._8_4_ ^ 0x80000000;
            auVar203._12_4_ = auVar179._12_4_ ^ 0x80000000;
            auVar228._0_4_ = -fVar242;
            auVar228._4_4_ = 0x80000000;
            auVar228._8_4_ = 0x80000000;
            auVar228._12_4_ = 0x80000000;
            auVar79 = vinsertps_avx(auVar228,ZEXT416((uint)(fVar168 * fVar222)),0x1c);
            auVar156 = vmovsldup_avx(ZEXT416((uint)(local_7c0._0_4_ * fVar168 * fVar222 -
                                                   auVar179._0_4_ * fVar242)));
            auVar79 = vdivps_avx(auVar79,auVar156);
            auVar83 = vinsertps_avx(local_7c0._0_16_,auVar203,0x10);
            auVar83 = vdivps_avx(auVar83,auVar156);
            auVar156 = vmovsldup_avx(local_a40._0_16_);
            auVar81 = ZEXT416((uint)(fVar189 - auVar81._0_4_));
            auVar179 = vmovsldup_avx(auVar81);
            auVar154._0_4_ = auVar156._0_4_ * auVar79._0_4_ + auVar179._0_4_ * auVar83._0_4_;
            auVar154._4_4_ = auVar156._4_4_ * auVar79._4_4_ + auVar179._4_4_ * auVar83._4_4_;
            auVar154._8_4_ = auVar156._8_4_ * auVar79._8_4_ + auVar179._8_4_ * auVar83._8_4_;
            auVar154._12_4_ = auVar156._12_4_ * auVar79._12_4_ + auVar179._12_4_ * auVar83._12_4_;
            auVar86 = vsubps_avx(auVar86,auVar154);
            auVar155._8_4_ = 0x7fffffff;
            auVar155._0_8_ = 0x7fffffff7fffffff;
            auVar155._12_4_ = 0x7fffffff;
            auVar79 = vandps_avx(local_a40._0_16_,auVar155);
            fVar189 = (float)local_820._4_4_;
            fVar245 = fStack_818;
            fVar190 = fStack_814;
            fVar248 = fStack_810;
            fVar191 = fStack_80c;
            fVar258 = fStack_808;
            fVar242 = (float)local_820._0_4_;
            fVar269 = (float)local_880._4_4_;
            fVar271 = fStack_878;
            fVar274 = fStack_874;
            fVar192 = fStack_870;
            fVar193 = fStack_86c;
            fVar194 = fStack_868;
            fVar168 = (float)local_880._0_4_;
            if (auVar79._0_4_ < (float)local_a60._0_4_) {
              auVar174._8_4_ = 0x7fffffff;
              auVar174._0_8_ = 0x7fffffff7fffffff;
              auVar174._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx(auVar81,auVar174);
              if (auVar79._0_4_ <
                  (float)local_6c0._0_4_ * 1.9073486e-06 + (float)local_a60._0_4_ + auVar12._0_4_) {
                fVar222 = auVar86._0_4_ + (float)local_770._0_4_;
                auVar365 = ZEXT3264(local_900);
                if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar222) &&
                   (fVar195 = (ray->super_RayK<1>).tfar, fVar222 <= fVar195)) {
                  auVar86 = vmovshdup_avx(auVar86);
                  fVar196 = auVar86._0_4_;
                  if ((0.0 <= fVar196) && (fVar196 <= 1.0)) {
                    auVar86 = vrsqrtss_avx(_local_840,_local_840);
                    fVar198 = auVar86._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar66].ptr;
                    if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
                      auVar86 = ZEXT416((uint)(fVar198 * 1.5 +
                                              local_840._0_4_ * -0.5 * fVar198 * fVar198 * fVar198))
                      ;
                      auVar86 = vshufps_avx(auVar86,auVar86,0);
                      auVar175._0_4_ = auVar86._0_4_ * (float)local_860._0_4_;
                      auVar175._4_4_ = auVar86._4_4_ * (float)local_860._4_4_;
                      auVar175._8_4_ = auVar86._8_4_ * fStack_858;
                      auVar175._12_4_ = auVar86._12_4_ * fStack_854;
                      auVar125._0_4_ = local_a20._0_4_ + auVar74._0_4_ * auVar175._0_4_;
                      auVar125._4_4_ = local_a20._4_4_ + auVar74._4_4_ * auVar175._4_4_;
                      auVar125._8_4_ = local_a20._8_4_ + auVar74._8_4_ * auVar175._8_4_;
                      auVar125._12_4_ = local_a20._12_4_ + auVar74._12_4_ * auVar175._12_4_;
                      auVar86 = vshufps_avx(auVar175,auVar175,0xc9);
                      auVar12 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xc9);
                      auVar176._0_4_ = auVar12._0_4_ * auVar175._0_4_;
                      auVar176._4_4_ = auVar12._4_4_ * auVar175._4_4_;
                      auVar176._8_4_ = auVar12._8_4_ * auVar175._8_4_;
                      auVar176._12_4_ = auVar12._12_4_ * auVar175._12_4_;
                      auVar204._0_4_ = local_a20._0_4_ * auVar86._0_4_;
                      auVar204._4_4_ = local_a20._4_4_ * auVar86._4_4_;
                      auVar204._8_4_ = local_a20._8_4_ * auVar86._8_4_;
                      auVar204._12_4_ = local_a20._12_4_ * auVar86._12_4_;
                      auVar79 = vsubps_avx(auVar204,auVar176);
                      auVar86 = vshufps_avx(auVar79,auVar79,0xc9);
                      auVar12 = vshufps_avx(auVar125,auVar125,0xc9);
                      auVar205._0_4_ = auVar12._0_4_ * auVar86._0_4_;
                      auVar205._4_4_ = auVar12._4_4_ * auVar86._4_4_;
                      auVar205._8_4_ = auVar12._8_4_ * auVar86._8_4_;
                      auVar205._12_4_ = auVar12._12_4_ * auVar86._12_4_;
                      auVar86 = vshufps_avx(auVar79,auVar79,0xd2);
                      auVar126._0_4_ = auVar125._0_4_ * auVar86._0_4_;
                      auVar126._4_4_ = auVar125._4_4_ * auVar86._4_4_;
                      auVar126._8_4_ = auVar125._8_4_ * auVar86._8_4_;
                      auVar126._12_4_ = auVar125._12_4_ * auVar86._12_4_;
                      auVar86 = vsubps_avx(auVar205,auVar126);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar222;
                        auVar12 = vshufps_avx(auVar86,auVar86,0xe9);
                        uVar3 = vmovlps_avx(auVar12);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar3;
                        (ray->Ng).field_0.field_0.z = auVar86._0_4_;
                        ray->u = fVar196;
                        ray->v = 0.0;
                        ray->primID = local_8a0._0_4_;
                        ray->geomID = uVar66;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar12 = vshufps_avx(auVar86,auVar86,0xe9);
                        local_8d0 = vmovlps_avx(auVar12);
                        local_8c8 = auVar86._0_4_;
                        local_8c4 = fVar196;
                        local_8c0 = 0;
                        local_8bc = local_8a0._0_4_;
                        local_8b8 = uVar66;
                        local_8b4 = context->user->instID[0];
                        local_8b0 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar222;
                        local_620._0_4_ = 0xffffffff;
                        local_a98.valid = (int *)local_620;
                        local_a98.geometryUserPtr = pGVar8->userPtr;
                        local_a98.context = context->user;
                        local_a98.hit = (RTCHitN *)&local_8d0;
                        local_a98.N = 1;
                        local_a98.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e43240:
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar296 = ZEXT1664(auVar296._0_16_);
                            (*p_Var10)(&local_a98);
                            if (*local_a98.valid == 0) goto LAB_00e432d4;
                          }
                          (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a98.hit;
                          (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a98.hit + 4);
                          (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a98.hit + 8);
                          *(float *)((long)local_a98.ray + 0x3c) = *(float *)(local_a98.hit + 0xc);
                          *(float *)((long)local_a98.ray + 0x40) = *(float *)(local_a98.hit + 0x10);
                          *(float *)((long)local_a98.ray + 0x44) = *(float *)(local_a98.hit + 0x14);
                          *(float *)((long)local_a98.ray + 0x48) = *(float *)(local_a98.hit + 0x18);
                          *(float *)((long)local_a98.ray + 0x4c) = *(float *)(local_a98.hit + 0x1c);
                          *(float *)((long)local_a98.ray + 0x50) = *(float *)(local_a98.hit + 0x20);
                        }
                        else {
                          auVar296 = ZEXT1664(local_900._0_16_);
                          (*pGVar8->intersectionFilterN)(&local_a98);
                          if (*local_a98.valid != 0) goto LAB_00e43240;
LAB_00e432d4:
                          (ray->super_RayK<1>).tfar = fVar195;
                        }
                        auVar367 = ZEXT3264(local_9c0);
                        auVar314 = ZEXT3264(local_9e0);
                        auVar318 = ZEXT3264(local_a00);
                        auVar365 = ZEXT3264(local_900);
                        auVar345 = ZEXT3264(local_9a0);
                        auVar307 = ZEXT3264(local_920);
                        fVar242 = (float)local_820._0_4_;
                        fVar189 = (float)local_820._4_4_;
                        fVar245 = fStack_818;
                        fVar190 = fStack_814;
                        fVar248 = fStack_810;
                        fVar191 = fStack_80c;
                        fVar258 = fStack_808;
                        fVar168 = (float)local_880._0_4_;
                        fVar269 = (float)local_880._4_4_;
                        fVar271 = fStack_878;
                        fVar274 = fStack_874;
                        fVar192 = fStack_870;
                        fVar193 = fStack_86c;
                        fVar194 = fStack_868;
                      }
                    }
                  }
                }
                break;
              }
            }
            lVar67 = lVar67 + -1;
            auVar365 = ZEXT3264(local_900);
          } while (lVar67 != 0);
          auVar329 = local_4c0;
          fVar222 = (ray->super_RayK<1>).tfar;
          auVar92._4_4_ = fVar222;
          auVar92._0_4_ = fVar222;
          auVar92._8_4_ = fVar222;
          auVar92._12_4_ = fVar222;
          auVar92._16_4_ = fVar222;
          auVar92._20_4_ = fVar222;
          auVar92._24_4_ = fVar222;
          auVar92._28_4_ = fVar222;
          auVar87 = vcmpps_avx(_local_760,auVar92,2);
          fVar222 = auVar87._28_4_;
          local_4c0 = vandps_avx(auVar87,local_4c0);
          auVar268 = ZEXT3264(local_4c0);
          auVar329 = auVar329 & auVar87;
          auVar263 = local_740._0_28_;
        } while ((((((((auVar329 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar329 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar329 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar329 >> 0x7f,0) != '\0') ||
                   (auVar329 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar329 >> 0xbf,0) != '\0') ||
                 (auVar329 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar329[0x1f] < '\0');
      }
      auVar139._0_4_ =
           auVar263._0_4_ * (float)local_580._0_4_ +
           fVar168 * (float)local_5a0._0_4_ + fVar242 * (float)local_5c0._0_4_;
      auVar139._4_4_ =
           auVar263._4_4_ * (float)local_580._4_4_ +
           fVar269 * (float)local_5a0._4_4_ + fVar189 * (float)local_5c0._4_4_;
      auVar139._8_4_ = auVar263._8_4_ * fStack_578 + fVar271 * fStack_598 + fVar245 * fStack_5b8;
      auVar139._12_4_ = auVar263._12_4_ * fStack_574 + fVar274 * fStack_594 + fVar190 * fStack_5b4;
      auVar139._16_4_ = auVar263._16_4_ * fStack_570 + fVar192 * fStack_590 + fVar248 * fStack_5b0;
      auVar139._20_4_ = auVar263._20_4_ * fStack_56c + fVar193 * fStack_58c + fVar191 * fStack_5ac;
      auVar139._24_4_ = auVar263._24_4_ * fStack_568 + fVar194 * fStack_588 + fVar258 * fStack_5a8;
      auVar139._28_4_ = fVar222 + fVar222 + auVar268._28_4_;
      auVar163._8_4_ = 0x7fffffff;
      auVar163._0_8_ = 0x7fffffff7fffffff;
      auVar163._12_4_ = 0x7fffffff;
      auVar163._16_4_ = 0x7fffffff;
      auVar163._20_4_ = 0x7fffffff;
      auVar163._24_4_ = 0x7fffffff;
      auVar163._28_4_ = 0x7fffffff;
      auVar87 = vandps_avx(auVar139,auVar163);
      auVar164._8_4_ = 0x3e99999a;
      auVar164._0_8_ = 0x3e99999a3e99999a;
      auVar164._12_4_ = 0x3e99999a;
      auVar164._16_4_ = 0x3e99999a;
      auVar164._20_4_ = 0x3e99999a;
      auVar164._24_4_ = 0x3e99999a;
      auVar164._28_4_ = 0x3e99999a;
      auVar87 = vcmpps_avx(auVar87,auVar164,1);
      auVar329 = vorps_avx(auVar87,local_520);
      auVar165._0_4_ = (float)local_640._0_4_ + local_600._0_4_;
      auVar165._4_4_ = (float)local_640._4_4_ + local_600._4_4_;
      auVar165._8_4_ = fStack_638 + local_600._8_4_;
      auVar165._12_4_ = fStack_634 + local_600._12_4_;
      auVar165._16_4_ = fStack_630 + local_600._16_4_;
      auVar165._20_4_ = fStack_62c + local_600._20_4_;
      auVar165._24_4_ = fStack_628 + local_600._24_4_;
      auVar165._28_4_ = fStack_624 + local_600._28_4_;
      auVar87 = vcmpps_avx(auVar165,auVar92,2);
      _local_760 = vandps_avx(auVar87,local_500);
      auVar166._8_4_ = 3;
      auVar166._0_8_ = 0x300000003;
      auVar166._12_4_ = 3;
      auVar166._16_4_ = 3;
      auVar166._20_4_ = 3;
      auVar166._24_4_ = 3;
      auVar166._28_4_ = 3;
      auVar188._8_4_ = 2;
      auVar188._0_8_ = 0x200000002;
      auVar188._12_4_ = 2;
      auVar188._16_4_ = 2;
      auVar188._20_4_ = 2;
      auVar188._24_4_ = 2;
      auVar188._28_4_ = 2;
      auVar87 = vblendvps_avx(auVar188,auVar166,auVar329);
      auVar58._4_4_ = fStack_55c;
      auVar58._0_4_ = local_560;
      auVar58._8_4_ = fStack_558;
      auVar58._12_4_ = fStack_554;
      auVar86 = vpcmpgtd_avx(auVar87._16_16_,auVar58);
      auVar12 = vpshufd_avx(_local_540,0);
      auVar12 = vpcmpgtd_avx(auVar87._0_16_,auVar12);
      auVar167._16_16_ = auVar86;
      auVar167._0_16_ = auVar92._0_16_;
      local_740 = vblendps_avx(ZEXT1632(auVar12),auVar167,0xf0);
      local_620 = vandnps_avx(local_740,_local_760);
      auVar87 = _local_760 & ~local_740;
      if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar87 >> 0x7f,0) != '\0') ||
            (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar87 >> 0xbf,0) != '\0') ||
          (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar87[0x1f] < '\0') {
        local_6c0._4_4_ = (float)local_640._4_4_ + local_480._4_4_;
        local_6c0._0_4_ = (float)local_640._0_4_ + local_480._0_4_;
        fStack_6b8 = fStack_638 + local_480._8_4_;
        fStack_6b4 = fStack_634 + local_480._12_4_;
        fStack_6b0 = fStack_630 + local_480._16_4_;
        fStack_6ac = fStack_62c + local_480._20_4_;
        fStack_6a8 = fStack_628 + local_480._24_4_;
        fStack_6a4 = fStack_624 + local_480._28_4_;
        local_6a0 = _local_480;
        do {
          auVar94._8_4_ = 0x7f800000;
          auVar94._0_8_ = 0x7f8000007f800000;
          auVar94._12_4_ = 0x7f800000;
          auVar94._16_4_ = 0x7f800000;
          auVar94._20_4_ = 0x7f800000;
          auVar94._24_4_ = 0x7f800000;
          auVar94._28_4_ = 0x7f800000;
          auVar87 = vblendvps_avx(auVar94,local_6a0,local_620);
          auVar329 = vshufps_avx(auVar87,auVar87,0xb1);
          auVar329 = vminps_avx(auVar87,auVar329);
          auVar88 = vshufpd_avx(auVar329,auVar329,5);
          auVar329 = vminps_avx(auVar329,auVar88);
          auVar88 = vperm2f128_avx(auVar329,auVar329,1);
          auVar329 = vminps_avx(auVar329,auVar88);
          auVar329 = vcmpps_avx(auVar87,auVar329,0);
          auVar88 = local_620 & auVar329;
          auVar87 = local_620;
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0x7f,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0xbf,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar88[0x1f] < '\0') {
            auVar87 = vandps_avx(auVar329,local_620);
          }
          uVar61 = vmovmskps_avx(auVar87);
          uVar64 = 0;
          if (uVar61 != 0) {
            for (; (uVar61 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
            }
          }
          uVar62 = (ulong)uVar64;
          *(undefined4 *)(local_620 + uVar62 * 4) = 0;
          aVar6 = (ray->super_RayK<1>).dir.field_0;
          _local_940 = (undefined1  [16])aVar6;
          auVar86 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
          fVar222 = local_1c0[uVar62];
          uVar64 = *(uint *)(local_460 + uVar62 * 4);
          if (auVar86._0_4_ < 0.0) {
            fVar168 = sqrtf(auVar86._0_4_);
          }
          else {
            auVar86 = vsqrtss_avx(auVar86,auVar86);
            fVar168 = auVar86._0_4_;
          }
          auVar12 = vminps_avx(_local_950,_local_970);
          auVar86 = vmaxps_avx(_local_950,_local_970);
          auVar79 = vminps_avx(_local_960,_local_980);
          auVar83 = vminps_avx(auVar12,auVar79);
          auVar12 = vmaxps_avx(_local_960,_local_980);
          auVar79 = vmaxps_avx(auVar86,auVar12);
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar83,auVar177);
          auVar12 = vandps_avx(auVar79,auVar177);
          auVar86 = vmaxps_avx(auVar86,auVar12);
          auVar12 = vmovshdup_avx(auVar86);
          auVar12 = vmaxss_avx(auVar12,auVar86);
          auVar86 = vshufpd_avx(auVar86,auVar86,1);
          auVar86 = vmaxss_avx(auVar86,auVar12);
          local_840._0_4_ = auVar86._0_4_ * 1.9073486e-06;
          local_7c0._0_4_ = fVar168 * 1.9073486e-06;
          local_680._0_16_ = vshufps_avx(auVar79,auVar79,0xff);
          auVar86 = vinsertps_avx(ZEXT416(uVar64),ZEXT416((uint)fVar222),0x10);
          lVar67 = 5;
          do {
            auVar12 = vmovshdup_avx(auVar86);
            fVar192 = auVar12._0_4_;
            local_a20._0_4_ = 1.0 - fVar192;
            auVar12 = vshufps_avx(auVar86,auVar86,0x55);
            fVar222 = auVar12._0_4_;
            fVar168 = auVar12._4_4_;
            fVar242 = auVar12._8_4_;
            fVar189 = auVar12._12_4_;
            auVar12 = vshufps_avx(ZEXT416((uint)local_a20._0_4_),ZEXT416((uint)local_a20._0_4_),0);
            fVar245 = auVar12._0_4_;
            fVar190 = auVar12._4_4_;
            fVar248 = auVar12._8_4_;
            fVar191 = auVar12._12_4_;
            fVar258 = (float)local_960._0_4_ * fVar222 + (float)local_970._0_4_ * fVar245;
            fVar269 = (float)local_960._4_4_ * fVar168 + (float)local_970._4_4_ * fVar190;
            fVar271 = fStack_958 * fVar242 + fStack_968 * fVar248;
            fVar274 = fStack_954 * fVar189 + fStack_964 * fVar191;
            auVar229._0_4_ =
                 fVar245 * ((float)local_970._0_4_ * fVar222 + fVar245 * (float)local_950._0_4_) +
                 fVar222 * fVar258;
            auVar229._4_4_ =
                 fVar190 * ((float)local_970._4_4_ * fVar168 + fVar190 * (float)local_950._4_4_) +
                 fVar168 * fVar269;
            auVar229._8_4_ =
                 fVar248 * (fStack_968 * fVar242 + fVar248 * fStack_948) + fVar242 * fVar271;
            auVar229._12_4_ =
                 fVar191 * (fStack_964 * fVar189 + fVar191 * fStack_944) + fVar189 * fVar274;
            auVar178._0_4_ =
                 fVar245 * fVar258 +
                 fVar222 * (fVar222 * (float)local_980._0_4_ + (float)local_960._0_4_ * fVar245);
            auVar178._4_4_ =
                 fVar190 * fVar269 +
                 fVar168 * (fVar168 * (float)local_980._4_4_ + (float)local_960._4_4_ * fVar190);
            auVar178._8_4_ =
                 fVar248 * fVar271 + fVar242 * (fVar242 * fStack_978 + fStack_958 * fVar248);
            auVar178._12_4_ =
                 fVar191 * fVar274 + fVar189 * (fVar189 * fStack_974 + fStack_954 * fVar191);
            auVar12 = vshufps_avx(auVar86,auVar86,0);
            auVar127._0_4_ = auVar12._0_4_ * (float)local_940._0_4_ + 0.0;
            auVar127._4_4_ = auVar12._4_4_ * (float)local_940._4_4_ + 0.0;
            auVar127._8_4_ = auVar12._8_4_ * fStack_938 + 0.0;
            auVar127._12_4_ = auVar12._12_4_ * fStack_934 + 0.0;
            auVar82._0_4_ = fVar245 * auVar229._0_4_ + fVar222 * auVar178._0_4_;
            auVar82._4_4_ = fVar190 * auVar229._4_4_ + fVar168 * auVar178._4_4_;
            auVar82._8_4_ = fVar248 * auVar229._8_4_ + fVar242 * auVar178._8_4_;
            auVar82._12_4_ = fVar191 * auVar229._12_4_ + fVar189 * auVar178._12_4_;
            local_7a0._0_16_ = auVar82;
            auVar12 = vsubps_avx(auVar127,auVar82);
            _local_860 = auVar12;
            auVar12 = vdpps_avx(auVar12,auVar12,0x7f);
            fVar222 = auVar12._0_4_;
            if (fVar222 < 0.0) {
              local_a20._0_16_ = ZEXT416((uint)local_a20._0_4_);
              local_a40._0_16_ = auVar229;
              local_a60._0_16_ = auVar178;
              fVar168 = sqrtf(fVar222);
              auVar178 = local_a60._0_16_;
              auVar229 = local_a40._0_16_;
            }
            else {
              auVar79 = vsqrtss_avx(auVar12,auVar12);
              fVar168 = auVar79._0_4_;
            }
            auVar79 = vsubps_avx(auVar178,auVar229);
            auVar287._0_4_ = auVar79._0_4_ * 3.0;
            auVar287._4_4_ = auVar79._4_4_ * 3.0;
            auVar287._8_4_ = auVar79._8_4_ * 3.0;
            auVar287._12_4_ = auVar79._12_4_ * 3.0;
            auVar79 = vshufps_avx(ZEXT416((uint)(fVar192 * 6.0)),ZEXT416((uint)(fVar192 * 6.0)),0);
            auVar83 = ZEXT416((uint)(((float)local_a20._0_4_ - (fVar192 + fVar192)) * 6.0));
            auVar156 = vshufps_avx(auVar83,auVar83,0);
            auVar83 = ZEXT416((uint)((fVar192 - ((float)local_a20._0_4_ + (float)local_a20._0_4_)) *
                                    6.0));
            auVar179 = vshufps_avx(auVar83,auVar83,0);
            auVar81 = vshufps_avx(ZEXT416((uint)((float)local_a20._0_4_ * 6.0)),
                                  ZEXT416((uint)((float)local_a20._0_4_ * 6.0)),0);
            auVar83 = vdpps_avx(auVar287,auVar287,0x7f);
            auVar128._0_4_ =
                 auVar81._0_4_ * (float)local_950._0_4_ +
                 auVar179._0_4_ * (float)local_970._0_4_ +
                 auVar79._0_4_ * (float)local_980._0_4_ + auVar156._0_4_ * (float)local_960._0_4_;
            auVar128._4_4_ =
                 auVar81._4_4_ * (float)local_950._4_4_ +
                 auVar179._4_4_ * (float)local_970._4_4_ +
                 auVar79._4_4_ * (float)local_980._4_4_ + auVar156._4_4_ * (float)local_960._4_4_;
            auVar128._8_4_ =
                 auVar81._8_4_ * fStack_948 +
                 auVar179._8_4_ * fStack_968 +
                 auVar79._8_4_ * fStack_978 + auVar156._8_4_ * fStack_958;
            auVar128._12_4_ =
                 auVar81._12_4_ * fStack_944 +
                 auVar179._12_4_ * fStack_964 +
                 auVar79._12_4_ * fStack_974 + auVar156._12_4_ * fStack_954;
            auVar79 = vblendps_avx(auVar83,_DAT_01f7aa10,0xe);
            auVar156 = vrsqrtss_avx(auVar79,auVar79);
            fVar189 = auVar156._0_4_;
            fVar242 = auVar83._0_4_;
            auVar156 = vdpps_avx(auVar287,auVar128,0x7f);
            auVar179 = vshufps_avx(auVar83,auVar83,0);
            auVar129._0_4_ = auVar128._0_4_ * auVar179._0_4_;
            auVar129._4_4_ = auVar128._4_4_ * auVar179._4_4_;
            auVar129._8_4_ = auVar128._8_4_ * auVar179._8_4_;
            auVar129._12_4_ = auVar128._12_4_ * auVar179._12_4_;
            auVar156 = vshufps_avx(auVar156,auVar156,0);
            auVar206._0_4_ = auVar287._0_4_ * auVar156._0_4_;
            auVar206._4_4_ = auVar287._4_4_ * auVar156._4_4_;
            auVar206._8_4_ = auVar287._8_4_ * auVar156._8_4_;
            auVar206._12_4_ = auVar287._12_4_ * auVar156._12_4_;
            auVar81 = vsubps_avx(auVar129,auVar206);
            auVar156 = vrcpss_avx(auVar79,auVar79);
            auVar79 = vmaxss_avx(ZEXT416((uint)local_840._0_4_),
                                 ZEXT416((uint)(auVar86._0_4_ * (float)local_7c0._0_4_)));
            auVar156 = ZEXT416((uint)(auVar156._0_4_ * (2.0 - fVar242 * auVar156._0_4_)));
            auVar156 = vshufps_avx(auVar156,auVar156,0);
            uVar62 = CONCAT44(auVar287._4_4_,auVar287._0_4_);
            auVar304._0_8_ = uVar62 ^ 0x8000000080000000;
            auVar304._8_4_ = -auVar287._8_4_;
            auVar304._12_4_ = -auVar287._12_4_;
            auVar179 = ZEXT416((uint)(fVar189 * 1.5 + fVar242 * -0.5 * fVar189 * fVar189 * fVar189))
            ;
            auVar179 = vshufps_avx(auVar179,auVar179,0);
            auVar180._0_4_ = auVar179._0_4_ * auVar81._0_4_ * auVar156._0_4_;
            auVar180._4_4_ = auVar179._4_4_ * auVar81._4_4_ * auVar156._4_4_;
            auVar180._8_4_ = auVar179._8_4_ * auVar81._8_4_ * auVar156._8_4_;
            auVar180._12_4_ = auVar179._12_4_ * auVar81._12_4_ * auVar156._12_4_;
            auVar262._0_4_ = auVar287._0_4_ * auVar179._0_4_;
            auVar262._4_4_ = auVar287._4_4_ * auVar179._4_4_;
            auVar262._8_4_ = auVar287._8_4_ * auVar179._8_4_;
            auVar262._12_4_ = auVar287._12_4_ * auVar179._12_4_;
            local_a20._0_16_ = auVar287;
            if (fVar242 < 0.0) {
              local_a40._0_4_ = fVar168;
              local_a60._0_16_ = auVar304;
              local_7e0._0_16_ = auVar262;
              _local_880 = auVar180;
              fVar242 = sqrtf(fVar242);
              auVar180 = _local_880;
              auVar262 = local_7e0._0_16_;
              auVar304 = local_a60._0_16_;
            }
            else {
              auVar83 = vsqrtss_avx(auVar83,auVar83);
              fVar242 = auVar83._0_4_;
              local_a40._0_4_ = fVar168;
            }
            auVar83 = vdpps_avx(_local_860,auVar262,0x7f);
            local_a60._0_4_ =
                 ((float)local_840._0_4_ / fVar242) * ((float)local_a40._0_4_ + 1.0) +
                 (float)local_a40._0_4_ * (float)local_840._0_4_ + auVar79._0_4_;
            auVar156 = vdpps_avx(auVar304,auVar262,0x7f);
            auVar179 = vdpps_avx(_local_860,auVar180,0x7f);
            auVar81 = vdpps_avx(_local_940,auVar262,0x7f);
            auVar74 = vdpps_avx(_local_860,auVar304,0x7f);
            fVar168 = auVar156._0_4_ + auVar179._0_4_;
            auVar296 = ZEXT464((uint)fVar168);
            fVar242 = auVar83._0_4_;
            auVar84._0_4_ = fVar242 * fVar242;
            auVar84._4_4_ = auVar83._4_4_ * auVar83._4_4_;
            auVar84._8_4_ = auVar83._8_4_ * auVar83._8_4_;
            auVar84._12_4_ = auVar83._12_4_ * auVar83._12_4_;
            auVar179 = vsubps_avx(auVar12,auVar84);
            auVar156 = vdpps_avx(_local_860,_local_940,0x7f);
            fVar189 = auVar74._0_4_ - fVar242 * fVar168;
            local_a40._0_16_ = auVar83;
            fVar245 = auVar156._0_4_ - fVar242 * auVar81._0_4_;
            auVar83 = vrsqrtss_avx(auVar179,auVar179);
            fVar190 = auVar179._0_4_;
            fVar242 = auVar83._0_4_;
            fVar242 = fVar242 * 1.5 + fVar190 * -0.5 * fVar242 * fVar242 * fVar242;
            if (fVar190 < 0.0) {
              local_7e0._0_16_ = auVar81;
              _local_880 = ZEXT416((uint)fVar168);
              local_820._0_4_ = fVar189;
              local_800._0_4_ = fVar245;
              local_660._0_4_ = fVar242;
              fVar168 = sqrtf(fVar190);
              auVar296 = ZEXT1664(_local_880);
              fVar242 = (float)local_660._0_4_;
              fVar189 = (float)local_820._0_4_;
              fVar245 = (float)local_800._0_4_;
              auVar81 = local_7e0._0_16_;
            }
            else {
              auVar83 = vsqrtss_avx(auVar179,auVar179);
              fVar168 = auVar83._0_4_;
            }
            auVar367 = ZEXT3264(local_9c0);
            auVar314 = ZEXT3264(local_9e0);
            auVar318 = ZEXT3264(local_a00);
            auVar365 = ZEXT3264(local_900);
            auVar345 = ZEXT3264(local_9a0);
            auVar307 = ZEXT3264(local_920);
            auVar85 = vpermilps_avx(local_7a0._0_16_,0xff);
            auVar74 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xff);
            fVar189 = fVar189 * fVar242 - auVar74._0_4_;
            auVar207._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
            auVar207._8_4_ = auVar81._8_4_ ^ 0x80000000;
            auVar207._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar230._0_4_ = -fVar189;
            auVar230._4_4_ = 0x80000000;
            auVar230._8_4_ = 0x80000000;
            auVar230._12_4_ = 0x80000000;
            auVar83 = vinsertps_avx(auVar230,ZEXT416((uint)(fVar245 * fVar242)),0x1c);
            auVar179 = vmovsldup_avx(ZEXT416((uint)(auVar296._0_4_ * fVar245 * fVar242 -
                                                   auVar81._0_4_ * fVar189)));
            auVar83 = vdivps_avx(auVar83,auVar179);
            auVar156 = vinsertps_avx(auVar296._0_16_,auVar207,0x10);
            auVar156 = vdivps_avx(auVar156,auVar179);
            auVar179 = vmovsldup_avx(local_a40._0_16_);
            auVar85 = ZEXT416((uint)(fVar168 - auVar85._0_4_));
            auVar81 = vmovsldup_avx(auVar85);
            auVar157._0_4_ = auVar179._0_4_ * auVar83._0_4_ + auVar81._0_4_ * auVar156._0_4_;
            auVar157._4_4_ = auVar179._4_4_ * auVar83._4_4_ + auVar81._4_4_ * auVar156._4_4_;
            auVar157._8_4_ = auVar179._8_4_ * auVar83._8_4_ + auVar81._8_4_ * auVar156._8_4_;
            auVar157._12_4_ = auVar179._12_4_ * auVar83._12_4_ + auVar81._12_4_ * auVar156._12_4_;
            auVar86 = vsubps_avx(auVar86,auVar157);
            auVar158._8_4_ = 0x7fffffff;
            auVar158._0_8_ = 0x7fffffff7fffffff;
            auVar158._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx(local_a40._0_16_,auVar158);
            if (auVar83._0_4_ < (float)local_a60._0_4_) {
              auVar181._8_4_ = 0x7fffffff;
              auVar181._0_8_ = 0x7fffffff7fffffff;
              auVar181._12_4_ = 0x7fffffff;
              auVar83 = vandps_avx(auVar85,auVar181);
              if (auVar83._0_4_ <
                  (float)local_680._0_4_ * 1.9073486e-06 + (float)local_a60._0_4_ + auVar79._0_4_) {
                fVar168 = auVar86._0_4_ + (float)local_770._0_4_;
                if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar168) &&
                   (fVar242 = (ray->super_RayK<1>).tfar, fVar168 <= fVar242)) {
                  auVar86 = vmovshdup_avx(auVar86);
                  fVar189 = auVar86._0_4_;
                  if ((0.0 <= fVar189) && (fVar189 <= 1.0)) {
                    auVar86 = vrsqrtss_avx(auVar12,auVar12);
                    fVar245 = auVar86._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar66].ptr;
                    if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
                      auVar86 = ZEXT416((uint)(fVar245 * 1.5 +
                                              fVar222 * -0.5 * fVar245 * fVar245 * fVar245));
                      auVar86 = vshufps_avx(auVar86,auVar86,0);
                      auVar182._0_4_ = auVar86._0_4_ * (float)local_860._0_4_;
                      auVar182._4_4_ = auVar86._4_4_ * (float)local_860._4_4_;
                      auVar182._8_4_ = auVar86._8_4_ * fStack_858;
                      auVar182._12_4_ = auVar86._12_4_ * fStack_854;
                      auVar130._0_4_ = local_a20._0_4_ + auVar74._0_4_ * auVar182._0_4_;
                      auVar130._4_4_ = local_a20._4_4_ + auVar74._4_4_ * auVar182._4_4_;
                      auVar130._8_4_ = local_a20._8_4_ + auVar74._8_4_ * auVar182._8_4_;
                      auVar130._12_4_ = local_a20._12_4_ + auVar74._12_4_ * auVar182._12_4_;
                      auVar86 = vshufps_avx(auVar182,auVar182,0xc9);
                      auVar12 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xc9);
                      auVar183._0_4_ = auVar12._0_4_ * auVar182._0_4_;
                      auVar183._4_4_ = auVar12._4_4_ * auVar182._4_4_;
                      auVar183._8_4_ = auVar12._8_4_ * auVar182._8_4_;
                      auVar183._12_4_ = auVar12._12_4_ * auVar182._12_4_;
                      auVar208._0_4_ = local_a20._0_4_ * auVar86._0_4_;
                      auVar208._4_4_ = local_a20._4_4_ * auVar86._4_4_;
                      auVar208._8_4_ = local_a20._8_4_ * auVar86._8_4_;
                      auVar208._12_4_ = local_a20._12_4_ * auVar86._12_4_;
                      auVar79 = vsubps_avx(auVar208,auVar183);
                      auVar86 = vshufps_avx(auVar79,auVar79,0xc9);
                      auVar12 = vshufps_avx(auVar130,auVar130,0xc9);
                      auVar209._0_4_ = auVar12._0_4_ * auVar86._0_4_;
                      auVar209._4_4_ = auVar12._4_4_ * auVar86._4_4_;
                      auVar209._8_4_ = auVar12._8_4_ * auVar86._8_4_;
                      auVar209._12_4_ = auVar12._12_4_ * auVar86._12_4_;
                      auVar86 = vshufps_avx(auVar79,auVar79,0xd2);
                      auVar131._0_4_ = auVar130._0_4_ * auVar86._0_4_;
                      auVar131._4_4_ = auVar130._4_4_ * auVar86._4_4_;
                      auVar131._8_4_ = auVar130._8_4_ * auVar86._8_4_;
                      auVar131._12_4_ = auVar130._12_4_ * auVar86._12_4_;
                      auVar86 = vsubps_avx(auVar209,auVar131);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar168;
                        auVar12 = vshufps_avx(auVar86,auVar86,0xe9);
                        uVar3 = vmovlps_avx(auVar12);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar3;
                        (ray->Ng).field_0.field_0.z = auVar86._0_4_;
                        ray->u = fVar189;
                        ray->v = 0.0;
                        ray->primID = local_8a0._0_4_;
                        ray->geomID = uVar66;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar12 = vshufps_avx(auVar86,auVar86,0xe9);
                        local_8d0 = vmovlps_avx(auVar12);
                        local_8c8 = auVar86._0_4_;
                        local_8c4 = fVar189;
                        local_8c0 = 0;
                        local_8bc = local_8a0._0_4_;
                        local_8b8 = uVar66;
                        local_8b4 = context->user->instID[0];
                        local_8b0 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar168;
                        local_a64 = -1;
                        local_a98.valid = &local_a64;
                        local_a98.geometryUserPtr = pGVar8->userPtr;
                        local_a98.context = context->user;
                        local_a98.hit = (RTCHitN *)&local_8d0;
                        local_a98.N = 1;
                        local_a98.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e43ce2:
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar296 = ZEXT1664(auVar296._0_16_);
                            (*p_Var10)(&local_a98);
                            if (*local_a98.valid == 0) goto LAB_00e43d76;
                          }
                          (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a98.hit;
                          (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a98.hit + 4);
                          (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a98.hit + 8);
                          *(float *)((long)local_a98.ray + 0x3c) = *(float *)(local_a98.hit + 0xc);
                          *(float *)((long)local_a98.ray + 0x40) = *(float *)(local_a98.hit + 0x10);
                          *(float *)((long)local_a98.ray + 0x44) = *(float *)(local_a98.hit + 0x14);
                          *(float *)((long)local_a98.ray + 0x48) = *(float *)(local_a98.hit + 0x18);
                          *(float *)((long)local_a98.ray + 0x4c) = *(float *)(local_a98.hit + 0x1c);
                          *(float *)((long)local_a98.ray + 0x50) = *(float *)(local_a98.hit + 0x20);
                        }
                        else {
                          auVar296 = ZEXT1664(auVar296._0_16_);
                          (*pGVar8->intersectionFilterN)(&local_a98);
                          if (*local_a98.valid != 0) goto LAB_00e43ce2;
LAB_00e43d76:
                          (ray->super_RayK<1>).tfar = fVar242;
                        }
                        auVar367 = ZEXT3264(local_9c0);
                        auVar314 = ZEXT3264(local_9e0);
                        auVar318 = ZEXT3264(local_a00);
                        auVar365 = ZEXT3264(local_900);
                        auVar345 = ZEXT3264(local_9a0);
                        auVar307 = ZEXT3264(local_920);
                      }
                    }
                  }
                }
                break;
              }
            }
            lVar67 = lVar67 + -1;
          } while (lVar67 != 0);
          auVar329 = local_620;
          fVar222 = (ray->super_RayK<1>).tfar;
          auVar92._4_4_ = fVar222;
          auVar92._0_4_ = fVar222;
          auVar92._8_4_ = fVar222;
          auVar92._12_4_ = fVar222;
          auVar92._16_4_ = fVar222;
          auVar92._20_4_ = fVar222;
          auVar92._24_4_ = fVar222;
          auVar92._28_4_ = fVar222;
          auVar87 = vcmpps_avx(_local_6c0,auVar92,2);
          local_620 = vandps_avx(auVar87,local_620);
          auVar329 = auVar329 & auVar87;
        } while ((((((((auVar329 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar329 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar329 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar329 >> 0x7f,0) != '\0') ||
                   (auVar329 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar329 >> 0xbf,0) != '\0') ||
                 (auVar329 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar329[0x1f] < '\0');
      }
      auVar268 = ZEXT3264(_local_480);
      auVar87 = vandps_avx(local_4e0,_local_5e0);
      auVar329 = vandps_avx(_local_760,local_740);
      auVar214._0_4_ = (float)local_640._0_4_ + local_440._0_4_;
      auVar214._4_4_ = (float)local_640._4_4_ + local_440._4_4_;
      auVar214._8_4_ = fStack_638 + local_440._8_4_;
      auVar214._12_4_ = fStack_634 + local_440._12_4_;
      auVar214._16_4_ = fStack_630 + local_440._16_4_;
      auVar214._20_4_ = fStack_62c + local_440._20_4_;
      auVar214._24_4_ = fStack_628 + local_440._24_4_;
      auVar214._28_4_ = fStack_624 + local_440._28_4_;
      auVar88 = vcmpps_avx(auVar214,auVar92,2);
      auVar87 = vandps_avx(auVar88,auVar87);
      auVar215._0_4_ = (float)local_640._0_4_ + local_480._0_4_;
      auVar215._4_4_ = (float)local_640._4_4_ + local_480._4_4_;
      auVar215._8_4_ = fStack_638 + local_480._8_4_;
      auVar215._12_4_ = fStack_634 + local_480._12_4_;
      auVar215._16_4_ = fStack_630 + local_480._16_4_;
      auVar215._20_4_ = fStack_62c + local_480._20_4_;
      auVar215._24_4_ = fStack_628 + local_480._24_4_;
      auVar215._28_4_ = fStack_624 + local_480._28_4_;
      auVar88 = vcmpps_avx(auVar215,auVar92,2);
      auVar329 = vandps_avx(auVar88,auVar329);
      auVar329 = vorps_avx(auVar87,auVar329);
      if ((((((((auVar329 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar329 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar329 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar329 >> 0x7f,0) != '\0') ||
            (auVar329 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar329 >> 0xbf,0) != '\0') ||
          (auVar329 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar329[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar69 * 0x60) = auVar329;
        auVar87 = vblendvps_avx(_local_480,local_440,auVar87);
        *(undefined1 (*) [32])(auStack_160 + uVar69 * 0x60) = auVar87;
        uVar3 = vmovlps_avx(local_490);
        (&uStack_140)[uVar69 * 0xc] = uVar3;
        aiStack_138[uVar69 * 0x18] = local_b0c + 1;
        iVar68 = iVar68 + 1;
      }
    }
    auVar329 = local_380;
    if (iVar68 == 0) break;
    fVar222 = (ray->super_RayK<1>).tfar;
    auVar134._4_4_ = fVar222;
    auVar134._0_4_ = fVar222;
    auVar134._8_4_ = fVar222;
    auVar134._12_4_ = fVar222;
    auVar134._16_4_ = fVar222;
    auVar134._20_4_ = fVar222;
    auVar134._24_4_ = fVar222;
    auVar134._28_4_ = fVar222;
    uVar64 = -iVar68;
    pauVar63 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar68 - 1) * 0x60);
    while( true ) {
      auVar87 = pauVar63[1];
      auVar160._0_4_ = auVar87._0_4_ + (float)local_640._0_4_;
      auVar160._4_4_ = auVar87._4_4_ + (float)local_640._4_4_;
      auVar160._8_4_ = auVar87._8_4_ + fStack_638;
      auVar160._12_4_ = auVar87._12_4_ + fStack_634;
      auVar160._16_4_ = auVar87._16_4_ + fStack_630;
      auVar160._20_4_ = auVar87._20_4_ + fStack_62c;
      auVar160._24_4_ = auVar87._24_4_ + fStack_628;
      auVar160._28_4_ = auVar87._28_4_ + fStack_624;
      auVar298 = vcmpps_avx(auVar160,auVar134,2);
      auVar88 = vandps_avx(auVar298,*pauVar63);
      local_440 = auVar88;
      auVar298 = *pauVar63 & auVar298;
      if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar298 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar298 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar298 >> 0x7f,0) != '\0') ||
            (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar298 >> 0xbf,0) != '\0') ||
          (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar298[0x1f] < '\0') break;
      pauVar63 = pauVar63 + -3;
      uVar64 = uVar64 + 1;
      if (uVar64 == 0) goto LAB_00e43fa7;
    }
    auVar90._8_4_ = 0x7f800000;
    auVar90._0_8_ = 0x7f8000007f800000;
    auVar90._12_4_ = 0x7f800000;
    auVar90._16_4_ = 0x7f800000;
    auVar90._20_4_ = 0x7f800000;
    auVar90._24_4_ = 0x7f800000;
    auVar90._28_4_ = 0x7f800000;
    auVar87 = vblendvps_avx(auVar90,auVar87,auVar88);
    auVar298 = vshufps_avx(auVar87,auVar87,0xb1);
    auVar298 = vminps_avx(auVar87,auVar298);
    auVar299 = vshufpd_avx(auVar298,auVar298,5);
    auVar298 = vminps_avx(auVar298,auVar299);
    auVar299 = vperm2f128_avx(auVar298,auVar298,1);
    auVar298 = vminps_avx(auVar298,auVar299);
    auVar87 = vcmpps_avx(auVar87,auVar298,0);
    auVar298 = auVar88 & auVar87;
    if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar298 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar298 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar298 >> 0x7f,0) != '\0') ||
          (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar298 >> 0xbf,0) != '\0') ||
        (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar298[0x1f] < '\0') {
      auVar88 = vandps_avx(auVar87,auVar88);
    }
    auVar77._8_8_ = 0;
    auVar77._0_8_ = *(ulong *)pauVar63[2];
    local_b0c = *(uint *)(pauVar63[2] + 8);
    uVar65 = vmovmskps_avx(auVar88);
    uVar61 = 0;
    if (uVar65 != 0) {
      for (; (uVar65 >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
      }
    }
    *(undefined4 *)(local_440 + (ulong)uVar61 * 4) = 0;
    *pauVar63 = local_440;
    uVar65 = ~uVar64;
    if ((((((((local_440 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_440 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_440 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_440 >> 0x7f,0) != '\0') ||
          (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_440 >> 0xbf,0) != '\0') ||
        (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_440[0x1f] < '\0') {
      uVar65 = -uVar64;
    }
    uVar69 = (ulong)uVar65;
    auVar86 = vshufps_avx(auVar77,auVar77,0);
    auVar12 = vshufps_avx(auVar77,auVar77,0x55);
    auVar12 = vsubps_avx(auVar12,auVar86);
    local_480._4_4_ = auVar86._4_4_ + auVar12._4_4_ * 0.14285715;
    local_480._0_4_ = auVar86._0_4_ + auVar12._0_4_ * 0.0;
    fStack_478 = auVar86._8_4_ + auVar12._8_4_ * 0.2857143;
    fStack_474 = auVar86._12_4_ + auVar12._12_4_ * 0.42857146;
    fStack_470 = auVar86._0_4_ + auVar12._0_4_ * 0.5714286;
    fStack_46c = auVar86._4_4_ + auVar12._4_4_ * 0.71428573;
    fStack_468 = auVar86._8_4_ + auVar12._8_4_ * 0.8571429;
    fStack_464 = auVar86._12_4_ + auVar12._12_4_;
    local_490._8_8_ = 0;
    local_490._0_8_ = *(ulong *)(local_480 + (ulong)uVar61 * 4);
    uVar62 = local_8a0._0_8_;
  } while( true );
LAB_00e43fa7:
  auVar86 = SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
  auVar86 = vshufps_avx(auVar86,auVar86,0);
  auVar86 = vcmpps_avx(local_4a0,auVar86,2);
  uVar66 = vmovmskps_avx(auVar86);
  uVar60 = uVar60 - 1 & uVar60 & uVar66;
  if (uVar60 == 0) {
    return;
  }
  goto LAB_00e4167e;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }